

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  BBox1f BVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  long lVar14;
  __int_type_conflict _Var15;
  RTCFilterFunctionN p_Var16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint uVar70;
  ulong uVar71;
  long lVar72;
  uint uVar73;
  ulong uVar74;
  bool bVar75;
  undefined4 uVar76;
  undefined8 unaff_RBP;
  LinearSpace3fa *pLVar77;
  bool bVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar111 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar166;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar168;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float t1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar222;
  float fVar234;
  float fVar235;
  undefined1 auVar223 [16];
  float fVar236;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar232 [32];
  vfloat4 b0;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar275;
  undefined1 auVar273 [32];
  float fVar288;
  float fVar289;
  vfloat4 a0_1;
  float fVar290;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar291;
  float fVar301;
  float fVar302;
  __m128 a;
  float fVar303;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  float fVar304;
  float fVar310;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar308;
  float fVar309;
  float fVar311;
  float fVar312;
  float fVar313;
  float in_register_0000151c;
  undefined1 auVar307 [32];
  float fVar314;
  float fVar315;
  float fVar321;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  float fVar319;
  float fVar320;
  undefined1 auVar318 [32];
  float fVar322;
  float fVar323;
  float fVar335;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar333;
  float fVar334;
  float in_register_0000159c;
  undefined1 auVar330 [32];
  undefined1 auVar332 [64];
  float fVar340;
  vfloat4 a0;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  float in_register_000015dc;
  undefined1 auVar339 [64];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_498 [16];
  undefined1 (*local_488) [16];
  LinearSpace3fa *local_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 auStack_408 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  vfloat_impl<4> p03;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  BBox1f cu_stack [4];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar233 [32];
  undefined1 auVar331 [32];
  
  PVar12 = prim[1];
  uVar71 = (ulong)(byte)PVar12;
  fVar139 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar244 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar244 = vinsertps_avx(auVar244,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar26 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar26 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar244 = vsubps_avx(auVar244,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar106._0_4_ = fVar139 * auVar244._0_4_;
  auVar106._4_4_ = fVar139 * auVar244._4_4_;
  auVar106._8_4_ = fVar139 * auVar244._8_4_;
  auVar106._12_4_ = fVar139 * auVar244._12_4_;
  auVar223._0_4_ = fVar139 * auVar26._0_4_;
  auVar223._4_4_ = fVar139 * auVar26._4_4_;
  auVar223._8_4_ = fVar139 * auVar26._8_4_;
  auVar223._12_4_ = fVar139 * auVar26._12_4_;
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 10)));
  auVar95._16_16_ = auVar26;
  auVar95._0_16_ = auVar244;
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 10)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar160._16_16_ = auVar26;
  auVar160._0_16_ = auVar244;
  auVar18 = vcvtdq2ps_avx(auVar160);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 10)));
  auVar177._16_16_ = auVar26;
  auVar177._0_16_ = auVar244;
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar19 = vcvtdq2ps_avx(auVar177);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 10)));
  auVar178._16_16_ = auVar26;
  auVar178._0_16_ = auVar244;
  auVar20 = vcvtdq2ps_avx(auVar178);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xc + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xc + 10)));
  auVar194._16_16_ = auVar26;
  auVar194._0_16_ = auVar244;
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xd + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xd + 10)));
  auVar21 = vcvtdq2ps_avx(auVar194);
  auVar195._16_16_ = auVar26;
  auVar195._0_16_ = auVar244;
  auVar22 = vcvtdq2ps_avx(auVar195);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x12 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x12 + 10)));
  auVar196._16_16_ = auVar26;
  auVar196._0_16_ = auVar244;
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x13 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar196);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x13 + 10)));
  auVar270._16_16_ = auVar26;
  auVar270._0_16_ = auVar244;
  auVar24 = vcvtdq2ps_avx(auVar270);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x14 + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x14 + 10)));
  auVar285._16_16_ = auVar26;
  auVar285._0_16_ = auVar244;
  auVar25 = vcvtdq2ps_avx(auVar285);
  auVar244 = vshufps_avx(auVar223,auVar223,0);
  auVar26 = vshufps_avx(auVar223,auVar223,0x55);
  auVar294 = vshufps_avx(auVar223,auVar223,0xaa);
  fVar139 = auVar294._0_4_;
  fVar200 = auVar294._4_4_;
  fVar166 = auVar294._8_4_;
  fVar216 = auVar294._12_4_;
  fVar167 = auVar26._0_4_;
  fVar217 = auVar26._4_4_;
  fVar168 = auVar26._8_4_;
  fVar218 = auVar26._12_4_;
  fVar169 = auVar244._0_4_;
  fVar219 = auVar244._4_4_;
  fVar170 = auVar244._8_4_;
  fVar220 = auVar244._12_4_;
  auVar307._0_4_ = fVar169 * auVar95._0_4_ + fVar167 * auVar18._0_4_ + fVar139 * auVar19._0_4_;
  auVar307._4_4_ = fVar219 * auVar95._4_4_ + fVar217 * auVar18._4_4_ + fVar200 * auVar19._4_4_;
  auVar307._8_4_ = fVar170 * auVar95._8_4_ + fVar168 * auVar18._8_4_ + fVar166 * auVar19._8_4_;
  auVar307._12_4_ = fVar220 * auVar95._12_4_ + fVar218 * auVar18._12_4_ + fVar216 * auVar19._12_4_;
  auVar307._16_4_ = fVar169 * auVar95._16_4_ + fVar167 * auVar18._16_4_ + fVar139 * auVar19._16_4_;
  auVar307._20_4_ = fVar219 * auVar95._20_4_ + fVar217 * auVar18._20_4_ + fVar200 * auVar19._20_4_;
  auVar307._24_4_ = fVar170 * auVar95._24_4_ + fVar168 * auVar18._24_4_ + fVar166 * auVar19._24_4_;
  auVar307._28_4_ = fVar218 + in_register_000015dc + in_register_0000151c;
  auVar298._0_4_ = fVar169 * auVar20._0_4_ + fVar167 * auVar21._0_4_ + auVar22._0_4_ * fVar139;
  auVar298._4_4_ = fVar219 * auVar20._4_4_ + fVar217 * auVar21._4_4_ + auVar22._4_4_ * fVar200;
  auVar298._8_4_ = fVar170 * auVar20._8_4_ + fVar168 * auVar21._8_4_ + auVar22._8_4_ * fVar166;
  auVar298._12_4_ = fVar220 * auVar20._12_4_ + fVar218 * auVar21._12_4_ + auVar22._12_4_ * fVar216;
  auVar298._16_4_ = fVar169 * auVar20._16_4_ + fVar167 * auVar21._16_4_ + auVar22._16_4_ * fVar139;
  auVar298._20_4_ = fVar219 * auVar20._20_4_ + fVar217 * auVar21._20_4_ + auVar22._20_4_ * fVar200;
  auVar298._24_4_ = fVar170 * auVar20._24_4_ + fVar168 * auVar21._24_4_ + auVar22._24_4_ * fVar166;
  auVar298._28_4_ = fVar218 + in_register_000015dc + in_register_0000159c;
  auVar232._0_4_ = fVar169 * auVar23._0_4_ + fVar167 * auVar24._0_4_ + auVar25._0_4_ * fVar139;
  auVar232._4_4_ = fVar219 * auVar23._4_4_ + fVar217 * auVar24._4_4_ + auVar25._4_4_ * fVar200;
  auVar232._8_4_ = fVar170 * auVar23._8_4_ + fVar168 * auVar24._8_4_ + auVar25._8_4_ * fVar166;
  auVar232._12_4_ = fVar220 * auVar23._12_4_ + fVar218 * auVar24._12_4_ + auVar25._12_4_ * fVar216;
  auVar232._16_4_ = fVar169 * auVar23._16_4_ + fVar167 * auVar24._16_4_ + auVar25._16_4_ * fVar139;
  auVar232._20_4_ = fVar219 * auVar23._20_4_ + fVar217 * auVar24._20_4_ + auVar25._20_4_ * fVar200;
  auVar232._24_4_ = fVar170 * auVar23._24_4_ + fVar168 * auVar24._24_4_ + auVar25._24_4_ * fVar166;
  auVar232._28_4_ = fVar220 + fVar218 + fVar216;
  auVar244 = vshufps_avx(auVar106,auVar106,0);
  auVar26 = vshufps_avx(auVar106,auVar106,0x55);
  auVar294 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar139 = auVar294._0_4_;
  fVar200 = auVar294._4_4_;
  fVar166 = auVar294._8_4_;
  fVar216 = auVar294._12_4_;
  fVar169 = auVar26._0_4_;
  fVar219 = auVar26._4_4_;
  fVar170 = auVar26._8_4_;
  fVar220 = auVar26._12_4_;
  fVar167 = auVar244._0_4_;
  fVar217 = auVar244._4_4_;
  fVar168 = auVar244._8_4_;
  fVar218 = auVar244._12_4_;
  auVar131._0_4_ = fVar167 * auVar95._0_4_ + fVar169 * auVar18._0_4_ + fVar139 * auVar19._0_4_;
  auVar131._4_4_ = fVar217 * auVar95._4_4_ + fVar219 * auVar18._4_4_ + fVar200 * auVar19._4_4_;
  auVar131._8_4_ = fVar168 * auVar95._8_4_ + fVar170 * auVar18._8_4_ + fVar166 * auVar19._8_4_;
  auVar131._12_4_ = fVar218 * auVar95._12_4_ + fVar220 * auVar18._12_4_ + fVar216 * auVar19._12_4_;
  auVar131._16_4_ = fVar167 * auVar95._16_4_ + fVar169 * auVar18._16_4_ + fVar139 * auVar19._16_4_;
  auVar131._20_4_ = fVar217 * auVar95._20_4_ + fVar219 * auVar18._20_4_ + fVar200 * auVar19._20_4_;
  auVar131._24_4_ = fVar168 * auVar95._24_4_ + fVar170 * auVar18._24_4_ + fVar166 * auVar19._24_4_;
  auVar131._28_4_ = auVar95._28_4_ + auVar18._28_4_ + auVar19._28_4_;
  auVar179._0_4_ = fVar167 * auVar20._0_4_ + auVar22._0_4_ * fVar139 + fVar169 * auVar21._0_4_;
  auVar179._4_4_ = fVar217 * auVar20._4_4_ + auVar22._4_4_ * fVar200 + fVar219 * auVar21._4_4_;
  auVar179._8_4_ = fVar168 * auVar20._8_4_ + auVar22._8_4_ * fVar166 + fVar170 * auVar21._8_4_;
  auVar179._12_4_ = fVar218 * auVar20._12_4_ + auVar22._12_4_ * fVar216 + fVar220 * auVar21._12_4_;
  auVar179._16_4_ = fVar167 * auVar20._16_4_ + auVar22._16_4_ * fVar139 + fVar169 * auVar21._16_4_;
  auVar179._20_4_ = fVar217 * auVar20._20_4_ + auVar22._20_4_ * fVar200 + fVar219 * auVar21._20_4_;
  auVar179._24_4_ = fVar168 * auVar20._24_4_ + auVar22._24_4_ * fVar166 + fVar170 * auVar21._24_4_;
  auVar179._28_4_ = auVar95._28_4_ + auVar22._28_4_ + auVar19._28_4_;
  auVar96._8_4_ = 0x7fffffff;
  auVar96._0_8_ = 0x7fffffff7fffffff;
  auVar96._12_4_ = 0x7fffffff;
  auVar96._16_4_ = 0x7fffffff;
  auVar96._20_4_ = 0x7fffffff;
  auVar96._24_4_ = 0x7fffffff;
  auVar96._28_4_ = 0x7fffffff;
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar161._16_4_ = 0x219392ef;
  auVar161._20_4_ = 0x219392ef;
  auVar161._24_4_ = 0x219392ef;
  auVar161._28_4_ = 0x219392ef;
  auVar95 = vandps_avx(auVar307,auVar96);
  auVar95 = vcmpps_avx(auVar95,auVar161,1);
  auVar18 = vblendvps_avx(auVar307,auVar161,auVar95);
  auVar95 = vandps_avx(auVar298,auVar96);
  auVar95 = vcmpps_avx(auVar95,auVar161,1);
  auVar19 = vblendvps_avx(auVar298,auVar161,auVar95);
  auVar95 = vandps_avx(auVar232,auVar96);
  auVar95 = vcmpps_avx(auVar95,auVar161,1);
  auVar95 = vblendvps_avx(auVar232,auVar161,auVar95);
  auVar20 = vrcpps_avx(auVar18);
  auVar197._0_4_ = fVar167 * auVar23._0_4_ + fVar169 * auVar24._0_4_ + auVar25._0_4_ * fVar139;
  auVar197._4_4_ = fVar217 * auVar23._4_4_ + fVar219 * auVar24._4_4_ + auVar25._4_4_ * fVar200;
  auVar197._8_4_ = fVar168 * auVar23._8_4_ + fVar170 * auVar24._8_4_ + auVar25._8_4_ * fVar166;
  auVar197._12_4_ = fVar218 * auVar23._12_4_ + fVar220 * auVar24._12_4_ + auVar25._12_4_ * fVar216;
  auVar197._16_4_ = fVar167 * auVar23._16_4_ + fVar169 * auVar24._16_4_ + auVar25._16_4_ * fVar139;
  auVar197._20_4_ = fVar217 * auVar23._20_4_ + fVar219 * auVar24._20_4_ + auVar25._20_4_ * fVar200;
  auVar197._24_4_ = fVar168 * auVar23._24_4_ + fVar170 * auVar24._24_4_ + auVar25._24_4_ * fVar166;
  auVar197._28_4_ = auVar21._28_4_ + fVar216 + 1e-18;
  fVar139 = auVar20._0_4_;
  fVar166 = auVar20._4_4_;
  auVar21._4_4_ = auVar18._4_4_ * fVar166;
  auVar21._0_4_ = auVar18._0_4_ * fVar139;
  fVar167 = auVar20._8_4_;
  auVar21._8_4_ = auVar18._8_4_ * fVar167;
  fVar168 = auVar20._12_4_;
  auVar21._12_4_ = auVar18._12_4_ * fVar168;
  fVar169 = auVar20._16_4_;
  auVar21._16_4_ = auVar18._16_4_ * fVar169;
  fVar170 = auVar20._20_4_;
  auVar21._20_4_ = auVar18._20_4_ * fVar170;
  fVar171 = auVar20._24_4_;
  auVar21._24_4_ = auVar18._24_4_ * fVar171;
  auVar21._28_4_ = 0x219392ef;
  auVar271._8_4_ = 0x3f800000;
  auVar271._0_8_ = 0x3f8000003f800000;
  auVar271._12_4_ = 0x3f800000;
  auVar271._16_4_ = 0x3f800000;
  auVar271._20_4_ = 0x3f800000;
  auVar271._24_4_ = 0x3f800000;
  auVar271._28_4_ = 0x3f800000;
  auVar21 = vsubps_avx(auVar271,auVar21);
  auVar18 = vrcpps_avx(auVar19);
  fVar139 = fVar139 + fVar139 * auVar21._0_4_;
  fVar166 = fVar166 + fVar166 * auVar21._4_4_;
  fVar167 = fVar167 + fVar167 * auVar21._8_4_;
  fVar168 = fVar168 + fVar168 * auVar21._12_4_;
  fVar169 = fVar169 + fVar169 * auVar21._16_4_;
  fVar170 = fVar170 + fVar170 * auVar21._20_4_;
  fVar171 = fVar171 + fVar171 * auVar21._24_4_;
  fVar200 = auVar18._0_4_;
  fVar216 = auVar18._4_4_;
  auVar22._4_4_ = auVar19._4_4_ * fVar216;
  auVar22._0_4_ = auVar19._0_4_ * fVar200;
  fVar217 = auVar18._8_4_;
  auVar22._8_4_ = auVar19._8_4_ * fVar217;
  fVar218 = auVar18._12_4_;
  auVar22._12_4_ = auVar19._12_4_ * fVar218;
  fVar219 = auVar18._16_4_;
  auVar22._16_4_ = auVar19._16_4_ * fVar219;
  fVar220 = auVar18._20_4_;
  auVar22._20_4_ = auVar19._20_4_ * fVar220;
  fVar221 = auVar18._24_4_;
  auVar22._24_4_ = auVar19._24_4_ * fVar221;
  auVar22._28_4_ = auVar20._28_4_;
  auVar19 = vsubps_avx(auVar271,auVar22);
  auVar18 = vrcpps_avx(auVar95);
  fVar200 = fVar200 + fVar200 * auVar19._0_4_;
  fVar216 = fVar216 + fVar216 * auVar19._4_4_;
  fVar217 = fVar217 + fVar217 * auVar19._8_4_;
  fVar218 = fVar218 + fVar218 * auVar19._12_4_;
  fVar219 = fVar219 + fVar219 * auVar19._16_4_;
  fVar220 = fVar220 + fVar220 * auVar19._20_4_;
  fVar221 = fVar221 + fVar221 * auVar19._24_4_;
  fVar222 = auVar18._0_4_;
  fVar234 = auVar18._4_4_;
  auVar19._4_4_ = fVar234 * auVar95._4_4_;
  auVar19._0_4_ = fVar222 * auVar95._0_4_;
  fVar235 = auVar18._8_4_;
  auVar19._8_4_ = fVar235 * auVar95._8_4_;
  fVar236 = auVar18._12_4_;
  auVar19._12_4_ = fVar236 * auVar95._12_4_;
  fVar237 = auVar18._16_4_;
  auVar19._16_4_ = fVar237 * auVar95._16_4_;
  fVar238 = auVar18._20_4_;
  auVar19._20_4_ = fVar238 * auVar95._20_4_;
  fVar239 = auVar18._24_4_;
  auVar19._24_4_ = fVar239 * auVar95._24_4_;
  auVar19._28_4_ = auVar95._28_4_;
  auVar95 = vsubps_avx(auVar271,auVar19);
  fVar222 = fVar222 + fVar222 * auVar95._0_4_;
  fVar234 = fVar234 + fVar234 * auVar95._4_4_;
  fVar235 = fVar235 + fVar235 * auVar95._8_4_;
  fVar236 = fVar236 + fVar236 * auVar95._12_4_;
  fVar237 = fVar237 + fVar237 * auVar95._16_4_;
  fVar238 = fVar238 + fVar238 * auVar95._20_4_;
  fVar239 = fVar239 + fVar239 * auVar95._24_4_;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar244 = vpmovsxwd_avx(auVar244);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar71 * 7 + 0xe);
  auVar26 = vpmovsxwd_avx(auVar26);
  auVar97._16_16_ = auVar26;
  auVar97._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar95 = vsubps_avx(auVar95,auVar131);
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar244 = vpmovsxwd_avx(auVar294);
  auVar79._0_4_ = fVar139 * auVar95._0_4_;
  auVar79._4_4_ = fVar166 * auVar95._4_4_;
  auVar79._8_4_ = fVar167 * auVar95._8_4_;
  auVar79._12_4_ = fVar168 * auVar95._12_4_;
  auVar20._16_4_ = fVar169 * auVar95._16_4_;
  auVar20._0_16_ = auVar79;
  auVar20._20_4_ = fVar170 * auVar95._20_4_;
  auVar20._24_4_ = fVar171 * auVar95._24_4_;
  auVar20._28_4_ = auVar95._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar71 * 9 + 0xe);
  auVar26 = vpmovsxwd_avx(auVar5);
  auVar248._16_16_ = auVar26;
  auVar248._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar248);
  auVar95 = vsubps_avx(auVar95,auVar131);
  auVar107._0_4_ = fVar139 * auVar95._0_4_;
  auVar107._4_4_ = fVar166 * auVar95._4_4_;
  auVar107._8_4_ = fVar167 * auVar95._8_4_;
  auVar107._12_4_ = fVar168 * auVar95._12_4_;
  auVar23._16_4_ = fVar169 * auVar95._16_4_;
  auVar23._0_16_ = auVar107;
  auVar23._20_4_ = fVar170 * auVar95._20_4_;
  auVar23._24_4_ = fVar171 * auVar95._24_4_;
  auVar23._28_4_ = auVar95._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar71 * 0xe + 6);
  auVar244 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar71 * 0xe + 0xe);
  auVar26 = vpmovsxwd_avx(auVar7);
  auVar162._16_16_ = auVar26;
  auVar162._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar162);
  auVar95 = vsubps_avx(auVar95,auVar179);
  auVar140._0_4_ = fVar200 * auVar95._0_4_;
  auVar140._4_4_ = fVar216 * auVar95._4_4_;
  auVar140._8_4_ = fVar217 * auVar95._8_4_;
  auVar140._12_4_ = fVar218 * auVar95._12_4_;
  auVar24._16_4_ = fVar219 * auVar95._16_4_;
  auVar24._0_16_ = auVar140;
  auVar24._20_4_ = fVar220 * auVar95._20_4_;
  auVar24._24_4_ = fVar221 * auVar95._24_4_;
  auVar24._28_4_ = auVar95._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar244 = vpmovsxwd_avx(auVar8);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 0xe);
  auVar26 = vpmovsxwd_avx(auVar227);
  auVar249._16_16_ = auVar26;
  auVar249._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar249);
  auVar95 = vsubps_avx(auVar95,auVar179);
  auVar172._0_4_ = fVar200 * auVar95._0_4_;
  auVar172._4_4_ = fVar216 * auVar95._4_4_;
  auVar172._8_4_ = fVar217 * auVar95._8_4_;
  auVar172._12_4_ = fVar218 * auVar95._12_4_;
  auVar25._16_4_ = fVar219 * auVar95._16_4_;
  auVar25._0_16_ = auVar172;
  auVar25._20_4_ = fVar220 * auVar95._20_4_;
  auVar25._24_4_ = fVar221 * auVar95._24_4_;
  auVar25._28_4_ = auVar95._28_4_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *(ulong *)(prim + uVar71 * 0x15 + 6);
  auVar244 = vpmovsxwd_avx(auVar293);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0x15 + 0xe);
  auVar26 = vpmovsxwd_avx(auVar9);
  auVar213._16_16_ = auVar26;
  auVar213._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar213);
  auVar95 = vsubps_avx(auVar95,auVar197);
  auVar201._0_4_ = fVar222 * auVar95._0_4_;
  auVar201._4_4_ = fVar234 * auVar95._4_4_;
  auVar201._8_4_ = fVar235 * auVar95._8_4_;
  auVar201._12_4_ = fVar236 * auVar95._12_4_;
  auVar29._16_4_ = fVar237 * auVar95._16_4_;
  auVar29._0_16_ = auVar201;
  auVar29._20_4_ = fVar238 * auVar95._20_4_;
  auVar29._24_4_ = fVar239 * auVar95._24_4_;
  auVar29._28_4_ = auVar95._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar244 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 0xe);
  auVar26 = vpmovsxwd_avx(auVar11);
  auVar250._16_16_ = auVar26;
  auVar250._0_16_ = auVar244;
  auVar95 = vcvtdq2ps_avx(auVar250);
  auVar95 = vsubps_avx(auVar95,auVar197);
  auVar181._0_4_ = fVar222 * auVar95._0_4_;
  auVar181._4_4_ = fVar234 * auVar95._4_4_;
  auVar181._8_4_ = fVar235 * auVar95._8_4_;
  auVar181._12_4_ = fVar236 * auVar95._12_4_;
  auVar30._16_4_ = fVar237 * auVar95._16_4_;
  auVar30._0_16_ = auVar181;
  auVar30._20_4_ = fVar238 * auVar95._20_4_;
  auVar30._24_4_ = fVar239 * auVar95._24_4_;
  auVar30._28_4_ = auVar95._28_4_;
  auVar244 = vpminsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar26 = vpminsd_avx(auVar79,auVar107);
  auVar286._16_16_ = auVar244;
  auVar286._0_16_ = auVar26;
  auVar244 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar26 = vpminsd_avx(auVar140,auVar172);
  auVar299._16_16_ = auVar244;
  auVar299._0_16_ = auVar26;
  auVar95 = vmaxps_avx(auVar286,auVar299);
  auVar244 = vpminsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar26 = vpminsd_avx(auVar201,auVar181);
  auVar318._16_16_ = auVar244;
  auVar318._0_16_ = auVar26;
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar330._4_4_ = uVar76;
  auVar330._0_4_ = uVar76;
  auVar330._8_4_ = uVar76;
  auVar330._12_4_ = uVar76;
  auVar330._16_4_ = uVar76;
  auVar330._20_4_ = uVar76;
  auVar330._24_4_ = uVar76;
  auVar330._28_4_ = uVar76;
  auVar18 = vmaxps_avx(auVar318,auVar330);
  auVar95 = vmaxps_avx(auVar95,auVar18);
  local_1b8._4_4_ = auVar95._4_4_ * 0.99999964;
  local_1b8._0_4_ = auVar95._0_4_ * 0.99999964;
  local_1b8._8_4_ = auVar95._8_4_ * 0.99999964;
  local_1b8._12_4_ = auVar95._12_4_ * 0.99999964;
  local_1b8._16_4_ = auVar95._16_4_ * 0.99999964;
  local_1b8._20_4_ = auVar95._20_4_ * 0.99999964;
  local_1b8._24_4_ = auVar95._24_4_ * 0.99999964;
  local_1b8._28_4_ = auVar95._28_4_;
  auVar244 = vpmaxsd_avx(auVar20._16_16_,auVar23._16_16_);
  auVar26 = vpmaxsd_avx(auVar79,auVar107);
  auVar98._16_16_ = auVar244;
  auVar98._0_16_ = auVar26;
  auVar244 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar26 = vpmaxsd_avx(auVar140,auVar172);
  auVar132._16_16_ = auVar244;
  auVar132._0_16_ = auVar26;
  auVar95 = vminps_avx(auVar98,auVar132);
  auVar244 = vpmaxsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar26 = vpmaxsd_avx(auVar201,auVar181);
  auVar133._16_16_ = auVar244;
  auVar133._0_16_ = auVar26;
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar163._4_4_ = uVar76;
  auVar163._0_4_ = uVar76;
  auVar163._8_4_ = uVar76;
  auVar163._12_4_ = uVar76;
  auVar163._16_4_ = uVar76;
  auVar163._20_4_ = uVar76;
  auVar163._24_4_ = uVar76;
  auVar163._28_4_ = uVar76;
  auVar18 = vminps_avx(auVar133,auVar163);
  auVar95 = vminps_avx(auVar95,auVar18);
  auVar18._4_4_ = auVar95._4_4_ * 1.0000004;
  auVar18._0_4_ = auVar95._0_4_ * 1.0000004;
  auVar18._8_4_ = auVar95._8_4_ * 1.0000004;
  auVar18._12_4_ = auVar95._12_4_ * 1.0000004;
  auVar18._16_4_ = auVar95._16_4_ * 1.0000004;
  auVar18._20_4_ = auVar95._20_4_ * 1.0000004;
  auVar18._24_4_ = auVar95._24_4_ * 1.0000004;
  auVar18._28_4_ = auVar95._28_4_;
  auVar95 = vcmpps_avx(local_1b8,auVar18,2);
  auVar244 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar134._16_16_ = auVar244;
  auVar134._0_16_ = auVar244;
  auVar18 = vcvtdq2ps_avx(auVar134);
  auVar18 = vcmpps_avx(_DAT_01f7b060,auVar18,1);
  auVar95 = vandps_avx(auVar95,auVar18);
  uVar76 = vmovmskps_avx(auVar95);
  uVar71 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar76);
  pLVar77 = pre->ray_space + k;
  auVar99._16_16_ = mm_lookupmask_ps._240_16_;
  auVar99._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar99,ZEXT832(0) << 0x20,0x80);
  local_488 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_480 = pLVar77;
LAB_009f5f42:
  if (uVar71 == 0) {
LAB_009f7d98:
    return uVar71 != 0;
  }
  lVar72 = 0;
  if (uVar71 != 0) {
    for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar70 = *(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[uVar70].ptr;
  lVar14 = *(long *)&pGVar13[1].time_range.upper;
  uVar74 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           (ulong)*(uint *)(prim + lVar72 * 4 + 6) *
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar2 = (float *)(lVar14 + (long)pGVar13[1].intersectionFilterN * uVar74);
  fVar169 = *pfVar2;
  fVar219 = pfVar2[1];
  fVar170 = pfVar2[2];
  fVar220 = pfVar2[3];
  lVar1 = uVar74 + 1;
  auVar244 = *(undefined1 (*) [16])(lVar14 + (long)pGVar13[1].intersectionFilterN * lVar1);
  _Var15 = pGVar13[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var15 + (long)pGVar13[2].userPtr * uVar74);
  fVar171 = *pfVar2;
  fVar221 = pfVar2[1];
  fVar222 = pfVar2[2];
  fVar234 = pfVar2[3];
  auVar26 = *(undefined1 (*) [16])(_Var15 + (long)pGVar13[2].userPtr * lVar1);
  pfVar2 = (float *)(pGVar13[2].intersectionFilterN + (long)pGVar13[2].pointQueryFunc * uVar74);
  pfVar3 = (float *)(pGVar13[2].intersectionFilterN + (long)pGVar13[2].pointQueryFunc * lVar1);
  auVar125._0_4_ = *pfVar3 * 0.33333334;
  auVar125._4_4_ = pfVar3[1] * 0.33333334;
  auVar125._8_4_ = pfVar3[2] * 0.33333334;
  auVar125._12_4_ = pfVar3[3] * 0.33333334;
  pfVar3 = (float *)((long)pGVar13[3].userPtr + uVar74 * *(long *)&pGVar13[3].fnumTimeSegments);
  auVar294 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar5 = vinsertps_avx(auVar294,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar235 = fVar169 + *pfVar2 * 0.33333334;
  fVar236 = fVar219 + pfVar2[1] * 0.33333334;
  fVar237 = fVar170 + pfVar2[2] * 0.33333334;
  fVar238 = fVar220 + pfVar2[3] * 0.33333334;
  auVar294 = vsubps_avx(auVar244,auVar125);
  fVar239 = fVar171 + *pfVar3 * 0.33333334;
  fVar288 = fVar221 + pfVar3[1] * 0.33333334;
  fVar289 = fVar222 + pfVar3[2] * 0.33333334;
  fVar290 = fVar234 + pfVar3[3] * 0.33333334;
  pfVar2 = (float *)((long)pGVar13[3].userPtr + *(long *)&pGVar13[3].fnumTimeSegments * lVar1);
  auVar108._0_4_ = *pfVar2 * 0.33333334;
  auVar108._4_4_ = pfVar2[1] * 0.33333334;
  auVar108._8_4_ = pfVar2[2] * 0.33333334;
  auVar108._12_4_ = pfVar2[3] * 0.33333334;
  auVar6 = vsubps_avx(auVar26,auVar108);
  fVar139 = auVar244._0_4_;
  fVar166 = auVar244._4_4_;
  fVar167 = auVar244._8_4_;
  fVar168 = auVar244._12_4_;
  fVar291 = auVar294._0_4_ * 0.0;
  fVar301 = auVar294._4_4_ * 0.0;
  fVar302 = auVar294._8_4_ * 0.0;
  fVar303 = auVar294._12_4_ * 0.0;
  fVar200 = fVar291 + fVar139 * 0.0;
  fVar216 = fVar301 + fVar166 * 0.0;
  fVar217 = fVar302 + fVar167 * 0.0;
  fVar218 = fVar303 + fVar168 * 0.0;
  fVar304 = fVar235 * 0.0;
  fVar308 = fVar236 * 0.0;
  fVar309 = fVar237 * 0.0;
  fVar310 = fVar238 * 0.0;
  local_5f8._0_4_ = fVar169 + fVar304 + fVar200;
  local_5f8._4_4_ = fVar219 + fVar308 + fVar216;
  fStack_5f0 = fVar170 + fVar309 + fVar217;
  fStack_5ec = fVar220 + fVar310 + fVar218;
  auVar113._0_4_ = fVar235 * 3.0 + fVar200;
  auVar113._4_4_ = fVar236 * 3.0 + fVar216;
  auVar113._8_4_ = fVar237 * 3.0 + fVar217;
  auVar113._12_4_ = fVar238 * 3.0 + fVar218;
  auVar252._0_4_ = fVar169 * 3.0;
  auVar252._4_4_ = fVar219 * 3.0;
  auVar252._8_4_ = fVar170 * 3.0;
  auVar252._12_4_ = fVar220 * 3.0;
  auVar10 = vsubps_avx(auVar113,auVar252);
  fVar200 = auVar26._0_4_;
  fVar216 = auVar26._4_4_;
  fVar217 = auVar26._8_4_;
  fVar218 = auVar26._12_4_;
  fVar315 = auVar6._0_4_ * 0.0;
  fVar319 = auVar6._4_4_ * 0.0;
  fVar320 = auVar6._8_4_ * 0.0;
  fVar321 = auVar6._12_4_ * 0.0;
  fVar235 = fVar200 * 0.0 + fVar315;
  fVar236 = fVar216 * 0.0 + fVar319;
  fVar237 = fVar217 * 0.0 + fVar320;
  fVar238 = fVar218 * 0.0 + fVar321;
  fVar323 = fVar239 * 0.0;
  fVar333 = fVar288 * 0.0;
  fVar334 = fVar289 * 0.0;
  fVar335 = fVar290 * 0.0;
  auVar336._0_4_ = fVar323 + fVar235 + fVar171;
  auVar336._4_4_ = fVar333 + fVar236 + fVar221;
  auVar336._8_4_ = fVar334 + fVar237 + fVar222;
  auVar336._12_4_ = fVar335 + fVar238 + fVar234;
  auVar253._0_4_ = fVar239 * 3.0 + fVar235;
  auVar253._4_4_ = fVar288 * 3.0 + fVar236;
  auVar253._8_4_ = fVar289 * 3.0 + fVar237;
  auVar253._12_4_ = fVar290 * 3.0 + fVar238;
  auVar279._0_4_ = fVar171 * 3.0;
  auVar279._4_4_ = fVar221 * 3.0;
  auVar279._8_4_ = fVar222 * 3.0;
  auVar279._12_4_ = fVar234 * 3.0;
  auVar7 = vsubps_avx(auVar253,auVar279);
  auVar292._0_4_ = fVar169 * 0.0;
  auVar292._4_4_ = fVar219 * 0.0;
  auVar292._8_4_ = fVar170 * 0.0;
  auVar292._12_4_ = fVar220 * 0.0;
  auVar114._0_4_ = auVar292._0_4_ + fVar304 + fVar291 + fVar139;
  auVar114._4_4_ = auVar292._4_4_ + fVar308 + fVar301 + fVar166;
  auVar114._8_4_ = auVar292._8_4_ + fVar309 + fVar302 + fVar167;
  auVar114._12_4_ = auVar292._12_4_ + fVar310 + fVar303 + fVar168;
  auVar182._0_4_ = fVar139 * 3.0;
  auVar182._4_4_ = fVar166 * 3.0;
  auVar182._8_4_ = fVar167 * 3.0;
  auVar182._12_4_ = fVar168 * 3.0;
  auVar254._0_4_ = auVar294._0_4_ * 3.0;
  auVar254._4_4_ = auVar294._4_4_ * 3.0;
  auVar254._8_4_ = auVar294._8_4_ * 3.0;
  auVar254._12_4_ = auVar294._12_4_ * 3.0;
  auVar244 = vsubps_avx(auVar182,auVar254);
  auVar183._0_4_ = fVar304 + auVar244._0_4_;
  auVar183._4_4_ = fVar308 + auVar244._4_4_;
  auVar183._8_4_ = fVar309 + auVar244._8_4_;
  auVar183._12_4_ = fVar310 + auVar244._12_4_;
  auVar11 = vsubps_avx(auVar183,auVar292);
  auVar202._0_4_ = fVar171 * 0.0;
  auVar202._4_4_ = fVar221 * 0.0;
  auVar202._8_4_ = fVar222 * 0.0;
  auVar202._12_4_ = fVar234 * 0.0;
  auVar264._0_4_ = fVar323 + fVar315 + fVar200 + auVar202._0_4_;
  auVar264._4_4_ = fVar333 + fVar319 + fVar216 + auVar202._4_4_;
  auVar264._8_4_ = fVar334 + fVar320 + fVar217 + auVar202._8_4_;
  auVar264._12_4_ = fVar335 + fVar321 + fVar218 + auVar202._12_4_;
  auVar224._0_4_ = fVar200 * 3.0;
  auVar224._4_4_ = fVar216 * 3.0;
  auVar224._8_4_ = fVar217 * 3.0;
  auVar224._12_4_ = fVar218 * 3.0;
  auVar240._0_4_ = auVar6._0_4_ * 3.0;
  auVar240._4_4_ = auVar6._4_4_ * 3.0;
  auVar240._8_4_ = auVar6._8_4_ * 3.0;
  auVar240._12_4_ = auVar6._12_4_ * 3.0;
  auVar244 = vsubps_avx(auVar224,auVar240);
  auVar225._0_4_ = fVar323 + auVar244._0_4_;
  auVar225._4_4_ = fVar333 + auVar244._4_4_;
  auVar225._8_4_ = fVar334 + auVar244._8_4_;
  auVar225._12_4_ = fVar335 + auVar244._12_4_;
  auVar8 = vsubps_avx(auVar225,auVar202);
  auVar244 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar26 = vshufps_avx(auVar336,auVar336,0xc9);
  fVar235 = auVar10._0_4_;
  auVar241._0_4_ = fVar235 * auVar26._0_4_;
  fVar237 = auVar10._4_4_;
  auVar241._4_4_ = fVar237 * auVar26._4_4_;
  fVar239 = auVar10._8_4_;
  auVar241._8_4_ = fVar239 * auVar26._8_4_;
  fVar289 = auVar10._12_4_;
  auVar241._12_4_ = fVar289 * auVar26._12_4_;
  auVar255._0_4_ = auVar336._0_4_ * auVar244._0_4_;
  auVar255._4_4_ = auVar336._4_4_ * auVar244._4_4_;
  auVar255._8_4_ = auVar336._8_4_ * auVar244._8_4_;
  auVar255._12_4_ = auVar336._12_4_ * auVar244._12_4_;
  auVar26 = vsubps_avx(auVar255,auVar241);
  auVar294 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar26 = vshufps_avx(auVar7,auVar7,0xc9);
  auVar242._0_4_ = fVar235 * auVar26._0_4_;
  auVar242._4_4_ = fVar237 * auVar26._4_4_;
  auVar242._8_4_ = fVar239 * auVar26._8_4_;
  auVar242._12_4_ = fVar289 * auVar26._12_4_;
  auVar203._0_4_ = auVar7._0_4_ * auVar244._0_4_;
  auVar203._4_4_ = auVar7._4_4_ * auVar244._4_4_;
  auVar203._8_4_ = auVar7._8_4_ * auVar244._8_4_;
  auVar203._12_4_ = auVar7._12_4_ * auVar244._12_4_;
  auVar244 = vsubps_avx(auVar203,auVar242);
  auVar6 = vshufps_avx(auVar244,auVar244,0xc9);
  auVar244 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar26 = vshufps_avx(auVar264,auVar264,0xc9);
  fVar291 = auVar11._0_4_;
  auVar204._0_4_ = fVar291 * auVar26._0_4_;
  fVar301 = auVar11._4_4_;
  auVar204._4_4_ = fVar301 * auVar26._4_4_;
  fVar302 = auVar11._8_4_;
  auVar204._8_4_ = fVar302 * auVar26._8_4_;
  fVar303 = auVar11._12_4_;
  auVar204._12_4_ = fVar303 * auVar26._12_4_;
  auVar265._0_4_ = auVar264._0_4_ * auVar244._0_4_;
  auVar265._4_4_ = auVar264._4_4_ * auVar244._4_4_;
  auVar265._8_4_ = auVar264._8_4_ * auVar244._8_4_;
  auVar265._12_4_ = auVar264._12_4_ * auVar244._12_4_;
  auVar26 = vsubps_avx(auVar265,auVar204);
  auVar7 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar26 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar266._0_4_ = auVar26._0_4_ * fVar291;
  auVar266._4_4_ = auVar26._4_4_ * fVar301;
  auVar266._8_4_ = auVar26._8_4_ * fVar302;
  auVar266._12_4_ = auVar26._12_4_ * fVar303;
  auVar226._0_4_ = auVar244._0_4_ * auVar8._0_4_;
  auVar226._4_4_ = auVar244._4_4_ * auVar8._4_4_;
  auVar226._8_4_ = auVar244._8_4_ * auVar8._8_4_;
  auVar226._12_4_ = auVar244._12_4_ * auVar8._12_4_;
  auVar244 = vsubps_avx(auVar226,auVar266);
  auVar8 = vshufps_avx(auVar244,auVar244,0xc9);
  auVar244 = vdpps_avx(auVar294,auVar294,0x7f);
  fVar167 = auVar244._0_4_;
  auVar293 = ZEXT416((uint)fVar167);
  auVar26 = vrsqrtss_avx(auVar293,auVar293);
  fVar139 = auVar26._0_4_;
  auVar26 = vdpps_avx(auVar294,auVar6,0x7f);
  auVar227 = ZEXT416((uint)(fVar139 * 1.5 - fVar167 * 0.5 * fVar139 * fVar139 * fVar139));
  auVar227 = vshufps_avx(auVar227,auVar227,0);
  fVar139 = auVar294._0_4_ * auVar227._0_4_;
  fVar200 = auVar294._4_4_ * auVar227._4_4_;
  fVar166 = auVar294._8_4_ * auVar227._8_4_;
  fVar216 = auVar294._12_4_ * auVar227._12_4_;
  auVar244 = vshufps_avx(auVar244,auVar244,0);
  auVar280._0_4_ = auVar244._0_4_ * auVar6._0_4_;
  auVar280._4_4_ = auVar244._4_4_ * auVar6._4_4_;
  auVar280._8_4_ = auVar244._8_4_ * auVar6._8_4_;
  auVar280._12_4_ = auVar244._12_4_ * auVar6._12_4_;
  auVar244 = vshufps_avx(auVar26,auVar26,0);
  auVar256._0_4_ = auVar244._0_4_ * auVar294._0_4_;
  auVar256._4_4_ = auVar244._4_4_ * auVar294._4_4_;
  auVar256._8_4_ = auVar244._8_4_ * auVar294._8_4_;
  auVar256._12_4_ = auVar244._12_4_ * auVar294._12_4_;
  auVar79 = vsubps_avx(auVar280,auVar256);
  auVar244 = vrcpss_avx(auVar293,auVar293);
  auVar244 = ZEXT416((uint)(auVar244._0_4_ * (2.0 - fVar167 * auVar244._0_4_)));
  auVar6 = vshufps_avx(auVar244,auVar244,0);
  auVar26 = vdpps_avx(auVar7,auVar7,0x7f);
  auVar244 = vblendps_avx(auVar26,_DAT_01f45a50,0xe);
  auVar294 = vrsqrtss_avx(auVar244,auVar244);
  fVar167 = auVar294._0_4_;
  auVar294 = ZEXT416((uint)(fVar167 * 1.5 - auVar26._0_4_ * 0.5 * fVar167 * fVar167 * fVar167));
  auVar293 = vshufps_avx(auVar294,auVar294,0);
  fVar167 = auVar293._0_4_ * auVar7._0_4_;
  fVar217 = auVar293._4_4_ * auVar7._4_4_;
  fVar168 = auVar293._8_4_ * auVar7._8_4_;
  fVar218 = auVar293._12_4_ * auVar7._12_4_;
  auVar294 = vdpps_avx(auVar7,auVar8,0x7f);
  auVar9 = vshufps_avx(auVar26,auVar26,0);
  auVar243._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar243._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar243._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar243._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar294 = vshufps_avx(auVar294,auVar294,0);
  auVar205._0_4_ = auVar294._0_4_ * auVar7._0_4_;
  auVar205._4_4_ = auVar294._4_4_ * auVar7._4_4_;
  auVar205._8_4_ = auVar294._8_4_ * auVar7._8_4_;
  auVar205._12_4_ = auVar294._12_4_ * auVar7._12_4_;
  auVar7 = vsubps_avx(auVar243,auVar205);
  auVar244 = vrcpss_avx(auVar244,auVar244);
  auVar244 = ZEXT416((uint)((2.0 - auVar26._0_4_ * auVar244._0_4_) * auVar244._0_4_));
  auVar244 = vshufps_avx(auVar244,auVar244,0);
  auVar26 = vshufps_avx(_local_5f8,_local_5f8,0xff);
  auVar267._0_4_ = auVar26._0_4_ * fVar139;
  auVar267._4_4_ = auVar26._4_4_ * fVar200;
  auVar267._8_4_ = auVar26._8_4_ * fVar166;
  auVar267._12_4_ = auVar26._12_4_ * fVar216;
  _local_428 = vsubps_avx(_local_5f8,auVar267);
  auVar294 = vshufps_avx(auVar10,auVar10,0xff);
  auVar228._0_4_ =
       auVar294._0_4_ * fVar139 + auVar227._0_4_ * auVar79._0_4_ * auVar6._0_4_ * auVar26._0_4_;
  auVar228._4_4_ =
       auVar294._4_4_ * fVar200 + auVar227._4_4_ * auVar79._4_4_ * auVar6._4_4_ * auVar26._4_4_;
  auVar228._8_4_ =
       auVar294._8_4_ * fVar166 + auVar227._8_4_ * auVar79._8_4_ * auVar6._8_4_ * auVar26._8_4_;
  auVar228._12_4_ =
       auVar294._12_4_ * fVar216 + auVar227._12_4_ * auVar79._12_4_ * auVar6._12_4_ * auVar26._12_4_
  ;
  auVar6 = vsubps_avx(auVar10,auVar228);
  local_438._0_4_ = auVar267._0_4_ + (float)local_5f8._0_4_;
  local_438._4_4_ = auVar267._4_4_ + (float)local_5f8._4_4_;
  fStack_430 = auVar267._8_4_ + fStack_5f0;
  fStack_42c = auVar267._12_4_ + fStack_5ec;
  auVar26 = vshufps_avx(auVar114,auVar114,0xff);
  auVar144._0_4_ = fVar167 * auVar26._0_4_;
  auVar144._4_4_ = fVar217 * auVar26._4_4_;
  auVar144._8_4_ = fVar168 * auVar26._8_4_;
  auVar144._12_4_ = fVar218 * auVar26._12_4_;
  _local_448 = vsubps_avx(auVar114,auVar144);
  auVar294 = vshufps_avx(auVar11,auVar11,0xff);
  auVar109._0_4_ =
       fVar167 * auVar294._0_4_ + auVar26._0_4_ * auVar293._0_4_ * auVar7._0_4_ * auVar244._0_4_;
  auVar109._4_4_ =
       fVar217 * auVar294._4_4_ + auVar26._4_4_ * auVar293._4_4_ * auVar7._4_4_ * auVar244._4_4_;
  auVar109._8_4_ =
       fVar168 * auVar294._8_4_ + auVar26._8_4_ * auVar293._8_4_ * auVar7._8_4_ * auVar244._8_4_;
  auVar109._12_4_ =
       fVar218 * auVar294._12_4_ +
       auVar26._12_4_ * auVar293._12_4_ * auVar7._12_4_ * auVar244._12_4_;
  auVar7 = vsubps_avx(auVar11,auVar109);
  fVar236 = auVar114._0_4_ + auVar144._0_4_;
  fVar238 = auVar114._4_4_ + auVar144._4_4_;
  fVar288 = auVar114._8_4_ + auVar144._8_4_;
  fVar290 = auVar114._12_4_ + auVar144._12_4_;
  local_458._0_4_ = local_428._0_4_ + auVar6._0_4_ * 0.33333334;
  local_458._4_4_ = local_428._4_4_ + auVar6._4_4_ * 0.33333334;
  fStack_450 = local_428._8_4_ + auVar6._8_4_ * 0.33333334;
  fStack_44c = local_428._12_4_ + auVar6._12_4_ * 0.33333334;
  auVar227 = vsubps_avx(_local_428,auVar5);
  auVar26 = vmovsldup_avx(auVar227);
  auVar244 = vmovshdup_avx(auVar227);
  auVar294 = vshufps_avx(auVar227,auVar227,0xaa);
  fVar139 = (pLVar77->vx).field_0.m128[0];
  fVar200 = (pLVar77->vx).field_0.m128[1];
  fVar166 = (pLVar77->vx).field_0.m128[2];
  fVar216 = (pLVar77->vx).field_0.m128[3];
  fVar167 = (pLVar77->vy).field_0.m128[0];
  fVar217 = (pLVar77->vy).field_0.m128[1];
  fVar168 = (pLVar77->vy).field_0.m128[2];
  fVar218 = (pLVar77->vy).field_0.m128[3];
  fVar169 = (pLVar77->vz).field_0.m128[0];
  fVar219 = (pLVar77->vz).field_0.m128[1];
  fVar170 = (pLVar77->vz).field_0.m128[2];
  fVar220 = (pLVar77->vz).field_0.m128[3];
  fVar171 = fVar139 * auVar26._0_4_ + auVar294._0_4_ * fVar169 + fVar167 * auVar244._0_4_;
  fVar222 = fVar200 * auVar26._4_4_ + auVar294._4_4_ * fVar219 + fVar217 * auVar244._4_4_;
  local_5f8._4_4_ = fVar222;
  local_5f8._0_4_ = fVar171;
  fStack_5f0 = fVar166 * auVar26._8_4_ + auVar294._8_4_ * fVar170 + fVar168 * auVar244._8_4_;
  fStack_5ec = fVar216 * auVar26._12_4_ + auVar294._12_4_ * fVar220 + fVar218 * auVar244._12_4_;
  auVar293 = vsubps_avx(_local_458,auVar5);
  auVar294 = vshufps_avx(auVar293,auVar293,0xaa);
  auVar244 = vmovshdup_avx(auVar293);
  auVar26 = vmovsldup_avx(auVar293);
  fVar221 = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + fVar169 * auVar294._0_4_;
  fVar234 = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + fVar219 * auVar294._4_4_;
  local_598._4_4_ = fVar234;
  local_598._0_4_ = fVar221;
  fStack_590 = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + fVar170 * auVar294._8_4_;
  fStack_58c = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + fVar220 * auVar294._12_4_;
  auVar206._0_4_ = auVar7._0_4_ * 0.33333334;
  auVar206._4_4_ = auVar7._4_4_ * 0.33333334;
  auVar206._8_4_ = auVar7._8_4_ * 0.33333334;
  auVar206._12_4_ = auVar7._12_4_ * 0.33333334;
  _local_468 = vsubps_avx(_local_448,auVar206);
  auVar9 = vsubps_avx(_local_468,auVar5);
  auVar294 = vshufps_avx(auVar9,auVar9,0xaa);
  auVar244 = vmovshdup_avx(auVar9);
  auVar26 = vmovsldup_avx(auVar9);
  auVar324._0_4_ = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + fVar169 * auVar294._0_4_;
  auVar324._4_4_ = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + fVar219 * auVar294._4_4_;
  auVar324._8_4_ = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + fVar170 * auVar294._8_4_;
  auVar324._12_4_ = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + fVar220 * auVar294._12_4_
  ;
  auVar10 = vsubps_avx(_local_448,auVar5);
  auVar294 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar244 = vmovshdup_avx(auVar10);
  auVar26 = vmovsldup_avx(auVar10);
  auVar316._0_4_ = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + auVar294._0_4_ * fVar169;
  auVar316._4_4_ = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + auVar294._4_4_ * fVar219;
  auVar316._8_4_ = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + auVar294._8_4_ * fVar170;
  auVar316._12_4_ = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + auVar294._12_4_ * fVar220
  ;
  auVar11 = vsubps_avx(_local_438,auVar5);
  auVar294 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar244 = vmovshdup_avx(auVar11);
  auVar26 = vmovsldup_avx(auVar11);
  auVar305._0_4_ = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + auVar294._0_4_ * fVar169;
  auVar305._4_4_ = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + auVar294._4_4_ * fVar219;
  auVar305._8_4_ = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + auVar294._8_4_ * fVar170;
  auVar305._12_4_ = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + auVar294._12_4_ * fVar220
  ;
  local_478._0_4_ = (float)local_438._0_4_ + (fVar235 + auVar228._0_4_) * 0.33333334;
  local_478._4_4_ = (float)local_438._4_4_ + (fVar237 + auVar228._4_4_) * 0.33333334;
  fStack_470 = fStack_430 + (fVar239 + auVar228._8_4_) * 0.33333334;
  fStack_46c = fStack_42c + (fVar289 + auVar228._12_4_) * 0.33333334;
  auVar79 = vsubps_avx(_local_478,auVar5);
  auVar294 = vshufps_avx(auVar79,auVar79,0xaa);
  auVar244 = vmovshdup_avx(auVar79);
  auVar26 = vmovsldup_avx(auVar79);
  auVar257._0_4_ = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + auVar294._0_4_ * fVar169;
  auVar257._4_4_ = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + auVar294._4_4_ * fVar219;
  auVar257._8_4_ = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + auVar294._8_4_ * fVar170;
  auVar257._12_4_ = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + auVar294._12_4_ * fVar220
  ;
  auVar245._0_4_ = (fVar291 + auVar109._0_4_) * 0.33333334;
  auVar245._4_4_ = (fVar301 + auVar109._4_4_) * 0.33333334;
  auVar245._8_4_ = (fVar302 + auVar109._8_4_) * 0.33333334;
  auVar245._12_4_ = (fVar303 + auVar109._12_4_) * 0.33333334;
  auVar27._4_4_ = fVar238;
  auVar27._0_4_ = fVar236;
  auVar27._8_4_ = fVar288;
  auVar27._12_4_ = fVar290;
  auVar106 = vsubps_avx(auVar27,auVar245);
  auVar107 = vsubps_avx(auVar106,auVar5);
  auVar294 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar244 = vmovshdup_avx(auVar107);
  auVar26 = vmovsldup_avx(auVar107);
  auVar110._0_4_ = auVar26._0_4_ * fVar139 + auVar244._0_4_ * fVar167 + fVar169 * auVar294._0_4_;
  auVar110._4_4_ = auVar26._4_4_ * fVar200 + auVar244._4_4_ * fVar217 + fVar219 * auVar294._4_4_;
  auVar110._8_4_ = auVar26._8_4_ * fVar166 + auVar244._8_4_ * fVar168 + fVar170 * auVar294._8_4_;
  auVar110._12_4_ = auVar26._12_4_ * fVar216 + auVar244._12_4_ * fVar218 + fVar220 * auVar294._12_4_
  ;
  auVar140 = vsubps_avx(auVar27,auVar5);
  auVar294 = vshufps_avx(auVar140,auVar140,0xaa);
  auVar244 = vmovshdup_avx(auVar140);
  auVar26 = vmovsldup_avx(auVar140);
  auVar80._0_4_ = fVar139 * auVar26._0_4_ + fVar167 * auVar244._0_4_ + fVar169 * auVar294._0_4_;
  auVar80._4_4_ = fVar200 * auVar26._4_4_ + fVar217 * auVar244._4_4_ + fVar219 * auVar294._4_4_;
  auVar80._8_4_ = fVar166 * auVar26._8_4_ + fVar168 * auVar244._8_4_ + fVar170 * auVar294._8_4_;
  auVar80._12_4_ = fVar216 * auVar26._12_4_ + fVar218 * auVar244._12_4_ + fVar220 * auVar294._12_4_;
  auVar5 = vmovlhps_avx(_local_5f8,auVar305);
  auVar6 = vmovlhps_avx(_local_598,auVar257);
  auVar7 = vmovlhps_avx(auVar324,auVar110);
  auVar8 = vmovlhps_avx(auVar316,auVar80);
  auVar244 = vminps_avx(auVar5,auVar6);
  auVar26 = vminps_avx(auVar7,auVar8);
  auVar294 = vminps_avx(auVar244,auVar26);
  auVar244 = vmaxps_avx(auVar5,auVar6);
  auVar26 = vmaxps_avx(auVar7,auVar8);
  auVar244 = vmaxps_avx(auVar244,auVar26);
  auVar26 = vshufpd_avx(auVar294,auVar294,3);
  auVar294 = vminps_avx(auVar294,auVar26);
  auVar26 = vshufpd_avx(auVar244,auVar244,3);
  auVar26 = vmaxps_avx(auVar244,auVar26);
  auVar229._8_4_ = 0x7fffffff;
  auVar229._0_8_ = 0x7fffffff7fffffff;
  auVar229._12_4_ = 0x7fffffff;
  auVar244 = vandps_avx(auVar294,auVar229);
  auVar26 = vandps_avx(auVar26,auVar229);
  auVar244 = vmaxps_avx(auVar244,auVar26);
  auVar26 = vmovshdup_avx(auVar244);
  auVar244 = vmaxss_avx(auVar26,auVar244);
  fVar200 = auVar244._0_4_ * 9.536743e-07;
  auVar244 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
  local_78._16_16_ = auVar244;
  local_78._0_16_ = auVar244;
  auVar84._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
  auVar84._8_4_ = auVar244._8_4_ ^ 0x80000000;
  auVar84._12_4_ = auVar244._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar84;
  local_98._0_16_ = auVar84;
  auVar244 = vpshufd_avx(ZEXT416(uVar70),0);
  auVar26 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar72 * 4 + 6)),0);
  bVar75 = false;
  uVar74 = 0;
  fVar139 = *(float *)(ray + k * 4 + 0x30);
  auVar294 = vsubps_avx(auVar6,auVar5);
  auVar172 = vsubps_avx(auVar7,auVar6);
  auVar181 = vsubps_avx(auVar8,auVar7);
  auVar201 = vsubps_avx(_local_438,_local_428);
  auVar223 = vsubps_avx(_local_478,_local_458);
  auVar27 = vsubps_avx(auVar106,_local_468);
  auVar28._4_4_ = fVar238;
  auVar28._0_4_ = fVar236;
  auVar28._8_4_ = fVar288;
  auVar28._12_4_ = fVar290;
  auVar28 = vsubps_avx(auVar28,_local_448);
  auVar332 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar339 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_009f671d:
  do {
    auVar204 = auVar339._0_16_;
    auVar203 = auVar332._0_16_;
    auVar84 = vshufps_avx(auVar203,auVar203,0x50);
    auVar325._8_4_ = 0x3f800000;
    auVar325._0_8_ = 0x3f8000003f800000;
    auVar325._12_4_ = 0x3f800000;
    auVar331._16_4_ = 0x3f800000;
    auVar331._0_16_ = auVar325;
    auVar331._20_4_ = 0x3f800000;
    auVar331._24_4_ = 0x3f800000;
    auVar331._28_4_ = 0x3f800000;
    auVar108 = vsubps_avx(auVar325,auVar84);
    fVar166 = auVar84._0_4_;
    fVar216 = auVar84._4_4_;
    fVar167 = auVar84._8_4_;
    fVar217 = auVar84._12_4_;
    fVar168 = auVar108._0_4_;
    fVar218 = auVar108._4_4_;
    fVar169 = auVar108._8_4_;
    fVar219 = auVar108._12_4_;
    auVar173._0_4_ = auVar305._0_4_ * fVar166 + fVar168 * fVar171;
    auVar173._4_4_ = auVar305._4_4_ * fVar216 + fVar218 * fVar222;
    auVar173._8_4_ = auVar305._0_4_ * fVar167 + fVar169 * fVar171;
    auVar173._12_4_ = auVar305._4_4_ * fVar217 + fVar219 * fVar222;
    auVar141._0_4_ = auVar257._0_4_ * fVar166 + fVar168 * fVar221;
    auVar141._4_4_ = auVar257._4_4_ * fVar216 + fVar218 * fVar234;
    auVar141._8_4_ = auVar257._0_4_ * fVar167 + fVar169 * fVar221;
    auVar141._12_4_ = auVar257._4_4_ * fVar217 + fVar219 * fVar234;
    auVar246._0_4_ = auVar110._0_4_ * fVar166 + auVar324._0_4_ * fVar168;
    auVar246._4_4_ = auVar110._4_4_ * fVar216 + auVar324._4_4_ * fVar218;
    auVar246._8_4_ = auVar110._0_4_ * fVar167 + auVar324._0_4_ * fVar169;
    auVar246._12_4_ = auVar110._4_4_ * fVar217 + auVar324._4_4_ * fVar219;
    auVar184._0_4_ = auVar80._0_4_ * fVar166 + auVar316._0_4_ * fVar168;
    auVar184._4_4_ = auVar80._4_4_ * fVar216 + auVar316._4_4_ * fVar218;
    auVar184._8_4_ = auVar80._0_4_ * fVar167 + auVar316._0_4_ * fVar169;
    auVar184._12_4_ = auVar80._4_4_ * fVar217 + auVar316._4_4_ * fVar219;
    auVar84 = vmovshdup_avx(auVar204);
    auVar108 = vshufps_avx(auVar204,auVar204,0);
    auVar272._16_16_ = auVar108;
    auVar272._0_16_ = auVar108;
    auVar109 = vshufps_avx(auVar204,auVar204,0x55);
    auVar100._16_16_ = auVar109;
    auVar100._0_16_ = auVar109;
    auVar95 = vsubps_avx(auVar100,auVar272);
    auVar109 = vshufps_avx(auVar173,auVar173,0);
    auVar125 = vshufps_avx(auVar173,auVar173,0x55);
    auVar113 = vshufps_avx(auVar141,auVar141,0);
    auVar144 = vshufps_avx(auVar141,auVar141,0x55);
    auVar114 = vshufps_avx(auVar246,auVar246,0);
    auVar182 = vshufps_avx(auVar246,auVar246,0x55);
    auVar183 = vshufps_avx(auVar184,auVar184,0);
    auVar202 = vshufps_avx(auVar184,auVar184,0x55);
    auVar84 = ZEXT416((uint)((auVar84._0_4_ - auVar339._0_4_) * 0.04761905));
    auVar84 = vshufps_avx(auVar84,auVar84,0);
    auVar287._0_4_ = auVar108._0_4_ + auVar95._0_4_ * 0.0;
    auVar287._4_4_ = auVar108._4_4_ + auVar95._4_4_ * 0.14285715;
    auVar287._8_4_ = auVar108._8_4_ + auVar95._8_4_ * 0.2857143;
    auVar287._12_4_ = auVar108._12_4_ + auVar95._12_4_ * 0.42857146;
    auVar287._16_4_ = auVar108._0_4_ + auVar95._16_4_ * 0.5714286;
    auVar287._20_4_ = auVar108._4_4_ + auVar95._20_4_ * 0.71428573;
    auVar287._24_4_ = auVar108._8_4_ + auVar95._24_4_ * 0.8571429;
    auVar287._28_4_ = auVar108._12_4_ + auVar95._28_4_;
    auVar20 = vsubps_avx(auVar331,auVar287);
    fVar166 = auVar113._0_4_;
    fVar167 = auVar113._4_4_;
    fVar168 = auVar113._8_4_;
    fVar169 = auVar113._12_4_;
    fVar334 = auVar20._0_4_;
    fVar335 = auVar20._4_4_;
    fVar274 = auVar20._8_4_;
    fVar275 = auVar20._12_4_;
    fVar276 = auVar20._16_4_;
    fVar277 = auVar20._20_4_;
    fVar278 = auVar20._24_4_;
    fVar309 = auVar144._0_4_;
    fVar315 = auVar144._4_4_;
    fVar320 = auVar144._8_4_;
    fVar323 = auVar144._12_4_;
    fVar322 = auVar125._12_4_ + 1.0;
    fVar302 = auVar114._0_4_;
    fVar303 = auVar114._4_4_;
    fVar304 = auVar114._8_4_;
    fVar308 = auVar114._12_4_;
    fVar170 = fVar302 * auVar287._0_4_ + fVar334 * fVar166;
    fVar220 = fVar303 * auVar287._4_4_ + fVar335 * fVar167;
    fVar235 = fVar304 * auVar287._8_4_ + fVar274 * fVar168;
    fVar237 = fVar308 * auVar287._12_4_ + fVar275 * fVar169;
    fVar239 = fVar302 * auVar287._16_4_ + fVar276 * fVar166;
    fVar289 = fVar303 * auVar287._20_4_ + fVar277 * fVar167;
    fVar291 = fVar304 * auVar287._24_4_ + fVar278 * fVar168;
    fVar216 = auVar182._0_4_;
    fVar217 = auVar182._4_4_;
    fVar218 = auVar182._8_4_;
    fVar219 = auVar182._12_4_;
    fVar310 = fVar309 * fVar334 + auVar287._0_4_ * fVar216;
    fVar319 = fVar315 * fVar335 + auVar287._4_4_ * fVar217;
    fVar321 = fVar320 * fVar274 + auVar287._8_4_ * fVar218;
    fVar333 = fVar323 * fVar275 + auVar287._12_4_ * fVar219;
    fVar311 = fVar309 * fVar276 + auVar287._16_4_ * fVar216;
    fVar312 = fVar315 * fVar277 + auVar287._20_4_ * fVar217;
    fVar313 = fVar320 * fVar278 + auVar287._24_4_ * fVar218;
    fVar314 = fVar323 + fVar169;
    auVar108 = vshufps_avx(auVar173,auVar173,0xaa);
    auVar113 = vshufps_avx(auVar173,auVar173,0xff);
    fVar301 = fVar308 + 0.0;
    auVar144 = vshufps_avx(auVar141,auVar141,0xaa);
    auVar114 = vshufps_avx(auVar141,auVar141,0xff);
    auVar198._0_4_ =
         fVar334 * (auVar287._0_4_ * fVar166 + fVar334 * auVar109._0_4_) + auVar287._0_4_ * fVar170;
    auVar198._4_4_ =
         fVar335 * (auVar287._4_4_ * fVar167 + fVar335 * auVar109._4_4_) + auVar287._4_4_ * fVar220;
    auVar198._8_4_ =
         fVar274 * (auVar287._8_4_ * fVar168 + fVar274 * auVar109._8_4_) + auVar287._8_4_ * fVar235;
    auVar198._12_4_ =
         fVar275 * (auVar287._12_4_ * fVar169 + fVar275 * auVar109._12_4_) +
         auVar287._12_4_ * fVar237;
    auVar198._16_4_ =
         fVar276 * (auVar287._16_4_ * fVar166 + fVar276 * auVar109._0_4_) +
         auVar287._16_4_ * fVar239;
    auVar198._20_4_ =
         fVar277 * (auVar287._20_4_ * fVar167 + fVar277 * auVar109._4_4_) +
         auVar287._20_4_ * fVar289;
    auVar198._24_4_ =
         fVar278 * (auVar287._24_4_ * fVar168 + fVar278 * auVar109._8_4_) +
         auVar287._24_4_ * fVar291;
    auVar198._28_4_ = auVar109._12_4_ + 1.0 + fVar219;
    auVar214._0_4_ =
         fVar334 * (fVar309 * auVar287._0_4_ + auVar125._0_4_ * fVar334) + auVar287._0_4_ * fVar310;
    auVar214._4_4_ =
         fVar335 * (fVar315 * auVar287._4_4_ + auVar125._4_4_ * fVar335) + auVar287._4_4_ * fVar319;
    auVar214._8_4_ =
         fVar274 * (fVar320 * auVar287._8_4_ + auVar125._8_4_ * fVar274) + auVar287._8_4_ * fVar321;
    auVar214._12_4_ =
         fVar275 * (fVar323 * auVar287._12_4_ + auVar125._12_4_ * fVar275) +
         auVar287._12_4_ * fVar333;
    auVar214._16_4_ =
         fVar276 * (fVar309 * auVar287._16_4_ + auVar125._0_4_ * fVar276) +
         auVar287._16_4_ * fVar311;
    auVar214._20_4_ =
         fVar277 * (fVar315 * auVar287._20_4_ + auVar125._4_4_ * fVar277) +
         auVar287._20_4_ * fVar312;
    auVar214._24_4_ =
         fVar278 * (fVar320 * auVar287._24_4_ + auVar125._8_4_ * fVar278) +
         auVar287._24_4_ * fVar313;
    auVar214._28_4_ = auVar202._12_4_ + fVar219;
    auVar101._0_4_ =
         fVar334 * fVar170 + auVar287._0_4_ * (fVar302 * fVar334 + auVar183._0_4_ * auVar287._0_4_);
    auVar101._4_4_ =
         fVar335 * fVar220 + auVar287._4_4_ * (fVar303 * fVar335 + auVar183._4_4_ * auVar287._4_4_);
    auVar101._8_4_ =
         fVar274 * fVar235 + auVar287._8_4_ * (fVar304 * fVar274 + auVar183._8_4_ * auVar287._8_4_);
    auVar101._12_4_ =
         fVar275 * fVar237 +
         auVar287._12_4_ * (fVar308 * fVar275 + auVar183._12_4_ * auVar287._12_4_);
    auVar101._16_4_ =
         fVar276 * fVar239 +
         auVar287._16_4_ * (fVar302 * fVar276 + auVar183._0_4_ * auVar287._16_4_);
    auVar101._20_4_ =
         fVar277 * fVar289 +
         auVar287._20_4_ * (fVar303 * fVar277 + auVar183._4_4_ * auVar287._20_4_);
    auVar101._24_4_ =
         fVar278 * fVar291 +
         auVar287._24_4_ * (fVar304 * fVar278 + auVar183._8_4_ * auVar287._24_4_);
    auVar101._28_4_ = fVar169 + 1.0 + fVar301;
    auVar300._0_4_ =
         fVar334 * fVar310 + auVar287._0_4_ * (auVar202._0_4_ * auVar287._0_4_ + fVar334 * fVar216);
    auVar300._4_4_ =
         fVar335 * fVar319 + auVar287._4_4_ * (auVar202._4_4_ * auVar287._4_4_ + fVar335 * fVar217);
    auVar300._8_4_ =
         fVar274 * fVar321 + auVar287._8_4_ * (auVar202._8_4_ * auVar287._8_4_ + fVar274 * fVar218);
    auVar300._12_4_ =
         fVar275 * fVar333 +
         auVar287._12_4_ * (auVar202._12_4_ * auVar287._12_4_ + fVar275 * fVar219);
    auVar300._16_4_ =
         fVar276 * fVar311 +
         auVar287._16_4_ * (auVar202._0_4_ * auVar287._16_4_ + fVar276 * fVar216);
    auVar300._20_4_ =
         fVar277 * fVar312 +
         auVar287._20_4_ * (auVar202._4_4_ * auVar287._20_4_ + fVar277 * fVar217);
    auVar300._24_4_ =
         fVar278 * fVar313 +
         auVar287._24_4_ * (auVar202._8_4_ * auVar287._24_4_ + fVar278 * fVar218);
    auVar300._28_4_ = fVar301 + fVar219 + 0.0;
    local_d8._0_4_ = fVar334 * auVar198._0_4_ + auVar287._0_4_ * auVar101._0_4_;
    local_d8._4_4_ = fVar335 * auVar198._4_4_ + auVar287._4_4_ * auVar101._4_4_;
    local_d8._8_4_ = fVar274 * auVar198._8_4_ + auVar287._8_4_ * auVar101._8_4_;
    local_d8._12_4_ = fVar275 * auVar198._12_4_ + auVar287._12_4_ * auVar101._12_4_;
    local_d8._16_4_ = fVar276 * auVar198._16_4_ + auVar287._16_4_ * auVar101._16_4_;
    local_d8._20_4_ = fVar277 * auVar198._20_4_ + auVar287._20_4_ * auVar101._20_4_;
    local_d8._24_4_ = fVar278 * auVar198._24_4_ + auVar287._24_4_ * auVar101._24_4_;
    local_d8._28_4_ = fVar314 + fVar219 + 0.0;
    auVar180._0_4_ = fVar334 * auVar214._0_4_ + auVar287._0_4_ * auVar300._0_4_;
    auVar180._4_4_ = fVar335 * auVar214._4_4_ + auVar287._4_4_ * auVar300._4_4_;
    auVar180._8_4_ = fVar274 * auVar214._8_4_ + auVar287._8_4_ * auVar300._8_4_;
    auVar180._12_4_ = fVar275 * auVar214._12_4_ + auVar287._12_4_ * auVar300._12_4_;
    auVar180._16_4_ = fVar276 * auVar214._16_4_ + auVar287._16_4_ * auVar300._16_4_;
    auVar180._20_4_ = fVar277 * auVar214._20_4_ + auVar287._20_4_ * auVar300._20_4_;
    auVar180._24_4_ = fVar278 * auVar214._24_4_ + auVar287._24_4_ * auVar300._24_4_;
    auVar180._28_4_ = fVar314 + fVar301;
    auVar21 = vsubps_avx(auVar101,auVar198);
    auVar95 = vsubps_avx(auVar300,auVar214);
    local_4e8 = auVar84._0_4_;
    fStack_4e4 = auVar84._4_4_;
    fStack_4e0 = auVar84._8_4_;
    fStack_4dc = auVar84._12_4_;
    local_118 = local_4e8 * auVar21._0_4_ * 3.0;
    fStack_114 = fStack_4e4 * auVar21._4_4_ * 3.0;
    auVar31._4_4_ = fStack_114;
    auVar31._0_4_ = local_118;
    fStack_110 = fStack_4e0 * auVar21._8_4_ * 3.0;
    auVar31._8_4_ = fStack_110;
    fStack_10c = fStack_4dc * auVar21._12_4_ * 3.0;
    auVar31._12_4_ = fStack_10c;
    fStack_108 = local_4e8 * auVar21._16_4_ * 3.0;
    auVar31._16_4_ = fStack_108;
    fStack_104 = fStack_4e4 * auVar21._20_4_ * 3.0;
    auVar31._20_4_ = fStack_104;
    fStack_100 = fStack_4e0 * auVar21._24_4_ * 3.0;
    auVar31._24_4_ = fStack_100;
    auVar31._28_4_ = auVar21._28_4_;
    local_138 = local_4e8 * auVar95._0_4_ * 3.0;
    fStack_134 = fStack_4e4 * auVar95._4_4_ * 3.0;
    auVar32._4_4_ = fStack_134;
    auVar32._0_4_ = local_138;
    fStack_130 = fStack_4e0 * auVar95._8_4_ * 3.0;
    auVar32._8_4_ = fStack_130;
    fStack_12c = fStack_4dc * auVar95._12_4_ * 3.0;
    auVar32._12_4_ = fStack_12c;
    fStack_128 = local_4e8 * auVar95._16_4_ * 3.0;
    auVar32._16_4_ = fStack_128;
    fStack_124 = fStack_4e4 * auVar95._20_4_ * 3.0;
    auVar32._20_4_ = fStack_124;
    fStack_120 = fStack_4e0 * auVar95._24_4_ * 3.0;
    auVar32._24_4_ = fStack_120;
    auVar32._28_4_ = fVar314;
    auVar18 = vsubps_avx(local_d8,auVar31);
    auVar95 = vperm2f128_avx(auVar18,auVar18,1);
    auVar95 = vshufps_avx(auVar95,auVar18,0x30);
    auVar95 = vshufps_avx(auVar18,auVar95,0x29);
    auVar19 = vsubps_avx(auVar180,auVar32);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar312 = auVar144._0_4_;
    fVar313 = auVar144._4_4_;
    fVar340 = auVar144._8_4_;
    fVar169 = auVar108._12_4_;
    fVar303 = auVar114._0_4_;
    fVar308 = auVar114._4_4_;
    fVar310 = auVar114._8_4_;
    fVar319 = auVar114._12_4_;
    auVar84 = vshufps_avx(auVar246,auVar246,0xaa);
    fVar166 = auVar84._0_4_;
    fVar167 = auVar84._4_4_;
    fVar168 = auVar84._8_4_;
    fVar219 = auVar84._12_4_;
    fVar235 = auVar287._0_4_ * fVar166 + fVar312 * fVar334;
    fVar237 = auVar287._4_4_ * fVar167 + fVar313 * fVar335;
    fVar239 = auVar287._8_4_ * fVar168 + fVar340 * fVar274;
    fVar289 = auVar287._12_4_ * fVar219 + auVar144._12_4_ * fVar275;
    fVar291 = auVar287._16_4_ * fVar166 + fVar312 * fVar276;
    fVar301 = auVar287._20_4_ * fVar167 + fVar313 * fVar277;
    fVar302 = auVar287._24_4_ * fVar168 + fVar340 * fVar278;
    auVar84 = vshufps_avx(auVar246,auVar246,0xff);
    fVar216 = auVar84._0_4_;
    fVar217 = auVar84._4_4_;
    fVar218 = auVar84._8_4_;
    fVar170 = auVar84._12_4_;
    fVar304 = auVar287._0_4_ * fVar216 + fVar303 * fVar334;
    fVar309 = auVar287._4_4_ * fVar217 + fVar308 * fVar335;
    fVar315 = auVar287._8_4_ * fVar218 + fVar310 * fVar274;
    fVar320 = auVar287._12_4_ * fVar170 + fVar319 * fVar275;
    fVar321 = auVar287._16_4_ * fVar216 + fVar303 * fVar276;
    fVar323 = auVar287._20_4_ * fVar217 + fVar308 * fVar277;
    fVar333 = auVar287._24_4_ * fVar218 + fVar310 * fVar278;
    auVar84 = vshufps_avx(auVar184,auVar184,0xaa);
    fVar311 = auVar84._12_4_ + fVar219;
    auVar109 = vshufps_avx(auVar184,auVar184,0xff);
    fVar220 = auVar109._12_4_;
    auVar102._0_4_ =
         fVar334 * (fVar312 * auVar287._0_4_ + fVar334 * auVar108._0_4_) + auVar287._0_4_ * fVar235;
    auVar102._4_4_ =
         fVar335 * (fVar313 * auVar287._4_4_ + fVar335 * auVar108._4_4_) + auVar287._4_4_ * fVar237;
    auVar102._8_4_ =
         fVar274 * (fVar340 * auVar287._8_4_ + fVar274 * auVar108._8_4_) + auVar287._8_4_ * fVar239;
    auVar102._12_4_ =
         fVar275 * (auVar144._12_4_ * auVar287._12_4_ + fVar275 * fVar169) +
         auVar287._12_4_ * fVar289;
    auVar102._16_4_ =
         fVar276 * (fVar312 * auVar287._16_4_ + fVar276 * auVar108._0_4_) +
         auVar287._16_4_ * fVar291;
    auVar102._20_4_ =
         fVar277 * (fVar313 * auVar287._20_4_ + fVar277 * auVar108._4_4_) +
         auVar287._20_4_ * fVar301;
    auVar102._24_4_ =
         fVar278 * (fVar340 * auVar287._24_4_ + fVar278 * auVar108._8_4_) +
         auVar287._24_4_ * fVar302;
    auVar102._28_4_ = auVar19._28_4_ + fVar169 + fVar220;
    auVar135._0_4_ =
         fVar334 * (fVar303 * auVar287._0_4_ + auVar113._0_4_ * fVar334) + auVar287._0_4_ * fVar304;
    auVar135._4_4_ =
         fVar335 * (fVar308 * auVar287._4_4_ + auVar113._4_4_ * fVar335) + auVar287._4_4_ * fVar309;
    auVar135._8_4_ =
         fVar274 * (fVar310 * auVar287._8_4_ + auVar113._8_4_ * fVar274) + auVar287._8_4_ * fVar315;
    auVar135._12_4_ =
         fVar275 * (fVar319 * auVar287._12_4_ + auVar113._12_4_ * fVar275) +
         auVar287._12_4_ * fVar320;
    auVar135._16_4_ =
         fVar276 * (fVar303 * auVar287._16_4_ + auVar113._0_4_ * fVar276) +
         auVar287._16_4_ * fVar321;
    auVar135._20_4_ =
         fVar277 * (fVar308 * auVar287._20_4_ + auVar113._4_4_ * fVar277) +
         auVar287._20_4_ * fVar323;
    auVar135._24_4_ =
         fVar278 * (fVar310 * auVar287._24_4_ + auVar113._8_4_ * fVar278) +
         auVar287._24_4_ * fVar333;
    auVar135._28_4_ = fVar169 + auVar18._28_4_ + fVar220;
    auVar18 = vperm2f128_avx(local_d8,local_d8,1);
    auVar18 = vshufps_avx(auVar18,local_d8,0x30);
    _local_418 = vshufps_avx(local_d8,auVar18,0x29);
    auVar215._0_4_ =
         auVar287._0_4_ * (auVar84._0_4_ * auVar287._0_4_ + fVar334 * fVar166) + fVar334 * fVar235;
    auVar215._4_4_ =
         auVar287._4_4_ * (auVar84._4_4_ * auVar287._4_4_ + fVar335 * fVar167) + fVar335 * fVar237;
    auVar215._8_4_ =
         auVar287._8_4_ * (auVar84._8_4_ * auVar287._8_4_ + fVar274 * fVar168) + fVar274 * fVar239;
    auVar215._12_4_ =
         auVar287._12_4_ * (auVar84._12_4_ * auVar287._12_4_ + fVar275 * fVar219) +
         fVar275 * fVar289;
    auVar215._16_4_ =
         auVar287._16_4_ * (auVar84._0_4_ * auVar287._16_4_ + fVar276 * fVar166) + fVar276 * fVar291
    ;
    auVar215._20_4_ =
         auVar287._20_4_ * (auVar84._4_4_ * auVar287._20_4_ + fVar277 * fVar167) + fVar277 * fVar301
    ;
    auVar215._24_4_ =
         auVar287._24_4_ * (auVar84._8_4_ * auVar287._24_4_ + fVar278 * fVar168) + fVar278 * fVar302
    ;
    auVar215._28_4_ = fVar311 + fVar322 + auVar214._28_4_;
    auVar263._0_4_ =
         fVar334 * fVar304 + auVar287._0_4_ * (auVar287._0_4_ * auVar109._0_4_ + fVar334 * fVar216);
    auVar263._4_4_ =
         fVar335 * fVar309 + auVar287._4_4_ * (auVar287._4_4_ * auVar109._4_4_ + fVar335 * fVar217);
    auVar263._8_4_ =
         fVar274 * fVar315 + auVar287._8_4_ * (auVar287._8_4_ * auVar109._8_4_ + fVar274 * fVar218);
    auVar263._12_4_ =
         fVar275 * fVar320 + auVar287._12_4_ * (auVar287._12_4_ * fVar220 + fVar275 * fVar170);
    auVar263._16_4_ =
         fVar276 * fVar321 +
         auVar287._16_4_ * (auVar287._16_4_ * auVar109._0_4_ + fVar276 * fVar216);
    auVar263._20_4_ =
         fVar277 * fVar323 +
         auVar287._20_4_ * (auVar287._20_4_ * auVar109._4_4_ + fVar277 * fVar217);
    auVar263._24_4_ =
         fVar278 * fVar333 +
         auVar287._24_4_ * (auVar287._24_4_ * auVar109._8_4_ + fVar278 * fVar218);
    auVar263._28_4_ = fVar322 + fVar319 + fVar220 + fVar170;
    auVar251._0_4_ = fVar334 * auVar102._0_4_ + auVar287._0_4_ * auVar215._0_4_;
    auVar251._4_4_ = fVar335 * auVar102._4_4_ + auVar287._4_4_ * auVar215._4_4_;
    auVar251._8_4_ = fVar274 * auVar102._8_4_ + auVar287._8_4_ * auVar215._8_4_;
    auVar251._12_4_ = fVar275 * auVar102._12_4_ + auVar287._12_4_ * auVar215._12_4_;
    auVar251._16_4_ = fVar276 * auVar102._16_4_ + auVar287._16_4_ * auVar215._16_4_;
    auVar251._20_4_ = fVar277 * auVar102._20_4_ + auVar287._20_4_ * auVar215._20_4_;
    auVar251._24_4_ = fVar278 * auVar102._24_4_ + auVar287._24_4_ * auVar215._24_4_;
    auVar251._28_4_ = fVar311 + fVar220 + fVar170;
    auVar273._0_4_ = fVar334 * auVar135._0_4_ + auVar287._0_4_ * auVar263._0_4_;
    auVar273._4_4_ = fVar335 * auVar135._4_4_ + auVar287._4_4_ * auVar263._4_4_;
    auVar273._8_4_ = fVar274 * auVar135._8_4_ + auVar287._8_4_ * auVar263._8_4_;
    auVar273._12_4_ = fVar275 * auVar135._12_4_ + auVar287._12_4_ * auVar263._12_4_;
    auVar273._16_4_ = fVar276 * auVar135._16_4_ + auVar287._16_4_ * auVar263._16_4_;
    auVar273._20_4_ = fVar277 * auVar135._20_4_ + auVar287._20_4_ * auVar263._20_4_;
    auVar273._24_4_ = fVar278 * auVar135._24_4_ + auVar287._24_4_ * auVar263._24_4_;
    auVar273._28_4_ = auVar20._28_4_ + auVar287._28_4_;
    auVar24 = vsubps_avx(auVar215,auVar102);
    auVar18 = vsubps_avx(auVar263,auVar135);
    local_158 = local_4e8 * auVar24._0_4_ * 3.0;
    fStack_154 = fStack_4e4 * auVar24._4_4_ * 3.0;
    auVar33._4_4_ = fStack_154;
    auVar33._0_4_ = local_158;
    fStack_150 = fStack_4e0 * auVar24._8_4_ * 3.0;
    auVar33._8_4_ = fStack_150;
    fStack_14c = fStack_4dc * auVar24._12_4_ * 3.0;
    auVar33._12_4_ = fStack_14c;
    fStack_148 = local_4e8 * auVar24._16_4_ * 3.0;
    auVar33._16_4_ = fStack_148;
    fStack_144 = fStack_4e4 * auVar24._20_4_ * 3.0;
    auVar33._20_4_ = fStack_144;
    fStack_140 = fStack_4e0 * auVar24._24_4_ * 3.0;
    auVar33._24_4_ = fStack_140;
    auVar33._28_4_ = auVar24._28_4_;
    local_178 = local_4e8 * auVar18._0_4_ * 3.0;
    fStack_174 = fStack_4e4 * auVar18._4_4_ * 3.0;
    auVar34._4_4_ = fStack_174;
    auVar34._0_4_ = local_178;
    fStack_170 = fStack_4e0 * auVar18._8_4_ * 3.0;
    auVar34._8_4_ = fStack_170;
    fStack_16c = fStack_4dc * auVar18._12_4_ * 3.0;
    auVar34._12_4_ = fStack_16c;
    fStack_168 = local_4e8 * auVar18._16_4_ * 3.0;
    auVar34._16_4_ = fStack_168;
    fStack_164 = fStack_4e4 * auVar18._20_4_ * 3.0;
    auVar34._20_4_ = fStack_164;
    fStack_160 = fStack_4e0 * auVar18._24_4_ * 3.0;
    auVar34._24_4_ = fStack_160;
    auVar34._28_4_ = auVar215._28_4_;
    auVar18 = vperm2f128_avx(auVar251,auVar251,1);
    auVar18 = vshufps_avx(auVar18,auVar251,0x30);
    auVar22 = vshufps_avx(auVar251,auVar18,0x29);
    auVar20 = vsubps_avx(auVar251,auVar33);
    auVar18 = vperm2f128_avx(auVar20,auVar20,1);
    auVar18 = vshufps_avx(auVar18,auVar20,0x30);
    auVar18 = vshufps_avx(auVar20,auVar18,0x29);
    auVar23 = vsubps_avx(auVar273,auVar34);
    auVar20 = vperm2f128_avx(auVar23,auVar23,1);
    auVar20 = vshufps_avx(auVar20,auVar23,0x30);
    local_b8 = vshufps_avx(auVar23,auVar20,0x29);
    auVar25 = vsubps_avx(auVar251,local_d8);
    auVar29 = vsubps_avx(auVar22,_local_418);
    fVar166 = auVar29._0_4_ + auVar25._0_4_;
    fVar216 = auVar29._4_4_ + auVar25._4_4_;
    fVar167 = auVar29._8_4_ + auVar25._8_4_;
    fVar217 = auVar29._12_4_ + auVar25._12_4_;
    fVar168 = auVar29._16_4_ + auVar25._16_4_;
    fVar218 = auVar29._20_4_ + auVar25._20_4_;
    fVar169 = auVar29._24_4_ + auVar25._24_4_;
    auVar20 = vperm2f128_avx(auVar180,auVar180,1);
    auVar20 = vshufps_avx(auVar20,auVar180,0x30);
    local_f8 = vshufps_avx(auVar180,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar273,auVar273,1);
    auVar20 = vshufps_avx(auVar20,auVar273,0x30);
    auVar23 = vshufps_avx(auVar273,auVar20,0x29);
    auVar20 = vsubps_avx(auVar273,auVar180);
    auVar30 = vsubps_avx(auVar23,local_f8);
    fVar219 = auVar30._0_4_ + auVar20._0_4_;
    fVar170 = auVar30._4_4_ + auVar20._4_4_;
    fVar220 = auVar30._8_4_ + auVar20._8_4_;
    fVar235 = auVar30._12_4_ + auVar20._12_4_;
    fVar237 = auVar30._16_4_ + auVar20._16_4_;
    fVar239 = auVar30._20_4_ + auVar20._20_4_;
    fVar289 = auVar30._24_4_ + auVar20._24_4_;
    auVar35._4_4_ = fVar216 * auVar180._4_4_;
    auVar35._0_4_ = fVar166 * auVar180._0_4_;
    auVar35._8_4_ = fVar167 * auVar180._8_4_;
    auVar35._12_4_ = fVar217 * auVar180._12_4_;
    auVar35._16_4_ = fVar168 * auVar180._16_4_;
    auVar35._20_4_ = fVar218 * auVar180._20_4_;
    auVar35._24_4_ = fVar169 * auVar180._24_4_;
    auVar35._28_4_ = auVar20._28_4_;
    auVar36._4_4_ = fVar170 * local_d8._4_4_;
    auVar36._0_4_ = fVar219 * local_d8._0_4_;
    auVar36._8_4_ = fVar220 * local_d8._8_4_;
    auVar36._12_4_ = fVar235 * local_d8._12_4_;
    auVar36._16_4_ = fVar237 * local_d8._16_4_;
    auVar36._20_4_ = fVar239 * local_d8._20_4_;
    auVar36._24_4_ = fVar289 * local_d8._24_4_;
    auVar36._28_4_ = fVar311;
    auVar96 = vsubps_avx(auVar35,auVar36);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar21._28_4_;
    local_138 = local_138 + auVar180._0_4_;
    fStack_134 = fStack_134 + auVar180._4_4_;
    fStack_130 = fStack_130 + auVar180._8_4_;
    fStack_12c = fStack_12c + auVar180._12_4_;
    fStack_128 = fStack_128 + auVar180._16_4_;
    fStack_124 = fStack_124 + auVar180._20_4_;
    fStack_120 = fStack_120 + auVar180._24_4_;
    fStack_11c = fVar314 + auVar180._28_4_;
    auVar37._4_4_ = fVar216 * fStack_134;
    auVar37._0_4_ = fVar166 * local_138;
    auVar37._8_4_ = fVar167 * fStack_130;
    auVar37._12_4_ = fVar217 * fStack_12c;
    auVar37._16_4_ = fVar168 * fStack_128;
    auVar37._20_4_ = fVar218 * fStack_124;
    auVar37._24_4_ = fVar169 * fStack_120;
    auVar37._28_4_ = fVar314;
    auVar38._4_4_ = fVar170 * fStack_114;
    auVar38._0_4_ = fVar219 * local_118;
    auVar38._8_4_ = fVar220 * fStack_110;
    auVar38._12_4_ = fVar235 * fStack_10c;
    auVar38._16_4_ = fVar237 * fStack_108;
    auVar38._20_4_ = fVar239 * fStack_104;
    auVar38._24_4_ = fVar289 * fStack_100;
    auVar38._28_4_ = fVar314 + auVar180._28_4_;
    auVar21 = vsubps_avx(auVar37,auVar38);
    local_598._0_4_ = auVar19._0_4_;
    local_598._4_4_ = auVar19._4_4_;
    fStack_590 = auVar19._8_4_;
    fStack_58c = auVar19._12_4_;
    fStack_588 = auVar19._16_4_;
    fStack_584 = auVar19._20_4_;
    fStack_580 = auVar19._24_4_;
    auVar39._4_4_ = fVar216 * (float)local_598._4_4_;
    auVar39._0_4_ = fVar166 * (float)local_598._0_4_;
    auVar39._8_4_ = fVar167 * fStack_590;
    auVar39._12_4_ = fVar217 * fStack_58c;
    auVar39._16_4_ = fVar168 * fStack_588;
    auVar39._20_4_ = fVar218 * fStack_584;
    auVar39._24_4_ = fVar169 * fStack_580;
    auVar39._28_4_ = fVar314;
    local_5f8._0_4_ = auVar95._0_4_;
    local_5f8._4_4_ = auVar95._4_4_;
    fStack_5f0 = auVar95._8_4_;
    fStack_5ec = auVar95._12_4_;
    fStack_5e8 = auVar95._16_4_;
    fStack_5e4 = auVar95._20_4_;
    fStack_5e0 = auVar95._24_4_;
    auVar40._4_4_ = fVar170 * (float)local_5f8._4_4_;
    auVar40._0_4_ = fVar219 * (float)local_5f8._0_4_;
    auVar40._8_4_ = fVar220 * fStack_5f0;
    auVar40._12_4_ = fVar235 * fStack_5ec;
    auVar40._16_4_ = fVar237 * fStack_5e8;
    auVar40._20_4_ = fVar239 * fStack_5e4;
    auVar40._24_4_ = fVar289 * fStack_5e0;
    auVar40._28_4_ = local_d8._28_4_;
    auVar97 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = local_f8._4_4_ * fVar216;
    auVar41._0_4_ = local_f8._0_4_ * fVar166;
    auVar41._8_4_ = local_f8._8_4_ * fVar167;
    auVar41._12_4_ = local_f8._12_4_ * fVar217;
    auVar41._16_4_ = local_f8._16_4_ * fVar168;
    auVar41._20_4_ = local_f8._20_4_ * fVar218;
    auVar41._24_4_ = local_f8._24_4_ * fVar169;
    auVar41._28_4_ = fVar314;
    auVar42._4_4_ = local_418._4_4_ * fVar170;
    auVar42._0_4_ = local_418._0_4_ * fVar219;
    auVar42._8_4_ = local_418._8_4_ * fVar220;
    auVar42._12_4_ = local_418._12_4_ * fVar235;
    auVar42._16_4_ = local_418._16_4_ * fVar237;
    auVar42._20_4_ = local_418._20_4_ * fVar239;
    auVar42._24_4_ = local_418._24_4_ * fVar289;
    auVar42._28_4_ = local_f8._28_4_;
    local_4e8 = auVar18._0_4_;
    fStack_4e4 = auVar18._4_4_;
    fStack_4e0 = auVar18._8_4_;
    fStack_4dc = auVar18._12_4_;
    fStack_4d8 = auVar18._16_4_;
    fStack_4d4 = auVar18._20_4_;
    fStack_4d0 = auVar18._24_4_;
    auVar98 = vsubps_avx(auVar41,auVar42);
    auVar43._4_4_ = auVar273._4_4_ * fVar216;
    auVar43._0_4_ = auVar273._0_4_ * fVar166;
    auVar43._8_4_ = auVar273._8_4_ * fVar167;
    auVar43._12_4_ = auVar273._12_4_ * fVar217;
    auVar43._16_4_ = auVar273._16_4_ * fVar168;
    auVar43._20_4_ = auVar273._20_4_ * fVar218;
    auVar43._24_4_ = auVar273._24_4_ * fVar169;
    auVar43._28_4_ = fVar314;
    auVar44._4_4_ = fVar170 * auVar251._4_4_;
    auVar44._0_4_ = fVar219 * auVar251._0_4_;
    auVar44._8_4_ = fVar220 * auVar251._8_4_;
    auVar44._12_4_ = fVar235 * auVar251._12_4_;
    auVar44._16_4_ = fVar237 * auVar251._16_4_;
    auVar44._20_4_ = fVar239 * auVar251._20_4_;
    auVar44._24_4_ = fVar289 * auVar251._24_4_;
    auVar44._28_4_ = fStack_fc;
    auVar99 = vsubps_avx(auVar43,auVar44);
    local_158 = auVar251._0_4_ + local_158;
    fStack_154 = auVar251._4_4_ + fStack_154;
    fStack_150 = auVar251._8_4_ + fStack_150;
    fStack_14c = auVar251._12_4_ + fStack_14c;
    fStack_148 = auVar251._16_4_ + fStack_148;
    fStack_144 = auVar251._20_4_ + fStack_144;
    fStack_140 = auVar251._24_4_ + fStack_140;
    fStack_13c = auVar251._28_4_ + auVar24._28_4_;
    local_178 = auVar273._0_4_ + local_178;
    fStack_174 = auVar273._4_4_ + fStack_174;
    fStack_170 = auVar273._8_4_ + fStack_170;
    fStack_16c = auVar273._12_4_ + fStack_16c;
    fStack_168 = auVar273._16_4_ + fStack_168;
    fStack_164 = auVar273._20_4_ + fStack_164;
    fStack_160 = auVar273._24_4_ + fStack_160;
    fStack_15c = auVar273._28_4_ + auVar215._28_4_;
    auVar45._4_4_ = fVar216 * fStack_174;
    auVar45._0_4_ = fVar166 * local_178;
    auVar45._8_4_ = fVar167 * fStack_170;
    auVar45._12_4_ = fVar217 * fStack_16c;
    auVar45._16_4_ = fVar168 * fStack_168;
    auVar45._20_4_ = fVar218 * fStack_164;
    auVar45._24_4_ = fVar169 * fStack_160;
    auVar45._28_4_ = auVar273._28_4_ + auVar215._28_4_;
    auVar46._4_4_ = fStack_154 * fVar170;
    auVar46._0_4_ = local_158 * fVar219;
    auVar46._8_4_ = fStack_150 * fVar220;
    auVar46._12_4_ = fStack_14c * fVar235;
    auVar46._16_4_ = fStack_148 * fVar237;
    auVar46._20_4_ = fStack_144 * fVar239;
    auVar46._24_4_ = fStack_140 * fVar289;
    auVar46._28_4_ = fStack_13c;
    auVar24 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar216 * local_b8._4_4_;
    auVar47._0_4_ = fVar166 * local_b8._0_4_;
    auVar47._8_4_ = fVar167 * local_b8._8_4_;
    auVar47._12_4_ = fVar217 * local_b8._12_4_;
    auVar47._16_4_ = fVar168 * local_b8._16_4_;
    auVar47._20_4_ = fVar218 * local_b8._20_4_;
    auVar47._24_4_ = fVar169 * local_b8._24_4_;
    auVar47._28_4_ = fStack_13c;
    auVar48._4_4_ = fVar170 * fStack_4e4;
    auVar48._0_4_ = fVar219 * local_4e8;
    auVar48._8_4_ = fVar220 * fStack_4e0;
    auVar48._12_4_ = fVar235 * fStack_4dc;
    auVar48._16_4_ = fVar237 * fStack_4d8;
    auVar48._20_4_ = fVar239 * fStack_4d4;
    auVar48._24_4_ = fVar289 * fStack_4d0;
    auVar48._28_4_ = local_b8._28_4_;
    auVar131 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar216 * auVar23._4_4_;
    auVar49._0_4_ = fVar166 * auVar23._0_4_;
    auVar49._8_4_ = fVar167 * auVar23._8_4_;
    auVar49._12_4_ = fVar217 * auVar23._12_4_;
    auVar49._16_4_ = fVar168 * auVar23._16_4_;
    auVar49._20_4_ = fVar218 * auVar23._20_4_;
    auVar49._24_4_ = fVar169 * auVar23._24_4_;
    auVar49._28_4_ = auVar29._28_4_ + auVar25._28_4_;
    auVar50._4_4_ = auVar22._4_4_ * fVar170;
    auVar50._0_4_ = auVar22._0_4_ * fVar219;
    auVar50._8_4_ = auVar22._8_4_ * fVar220;
    auVar50._12_4_ = auVar22._12_4_ * fVar235;
    auVar50._16_4_ = auVar22._16_4_ * fVar237;
    auVar50._20_4_ = auVar22._20_4_ * fVar239;
    auVar50._24_4_ = auVar22._24_4_ * fVar289;
    auVar50._28_4_ = auVar30._28_4_ + auVar20._28_4_;
    auVar25 = vsubps_avx(auVar49,auVar50);
    auVar18 = vminps_avx(auVar96,auVar21);
    auVar95 = vmaxps_avx(auVar96,auVar21);
    auVar19 = vminps_avx(auVar97,auVar98);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar97,auVar98);
    auVar95 = vmaxps_avx(auVar95,auVar18);
    auVar20 = vminps_avx(auVar99,auVar24);
    auVar18 = vmaxps_avx(auVar99,auVar24);
    auVar21 = vminps_avx(auVar131,auVar25);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar21 = vminps_avx(auVar19,auVar21);
    auVar19 = vmaxps_avx(auVar131,auVar25);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar95,auVar18);
    auVar95 = vcmpps_avx(auVar21,local_78,2);
    auVar18 = vcmpps_avx(auVar18,local_98,5);
    auVar95 = vandps_avx(auVar18,auVar95);
    auVar18 = local_198 & auVar95;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(_local_418,local_d8);
      auVar19 = vsubps_avx(auVar22,auVar251);
      fVar216 = auVar18._0_4_ + auVar19._0_4_;
      fVar167 = auVar18._4_4_ + auVar19._4_4_;
      fVar217 = auVar18._8_4_ + auVar19._8_4_;
      fVar168 = auVar18._12_4_ + auVar19._12_4_;
      fVar218 = auVar18._16_4_ + auVar19._16_4_;
      fVar169 = auVar18._20_4_ + auVar19._20_4_;
      fVar219 = auVar18._24_4_ + auVar19._24_4_;
      auVar21 = vsubps_avx(local_f8,auVar180);
      auVar24 = vsubps_avx(auVar23,auVar273);
      fVar170 = auVar21._0_4_ + auVar24._0_4_;
      fVar220 = auVar21._4_4_ + auVar24._4_4_;
      fVar235 = auVar21._8_4_ + auVar24._8_4_;
      fVar237 = auVar21._12_4_ + auVar24._12_4_;
      fVar239 = auVar21._16_4_ + auVar24._16_4_;
      fVar289 = auVar21._20_4_ + auVar24._20_4_;
      fVar291 = auVar21._24_4_ + auVar24._24_4_;
      fVar166 = auVar24._28_4_;
      auVar51._4_4_ = auVar180._4_4_ * fVar167;
      auVar51._0_4_ = auVar180._0_4_ * fVar216;
      auVar51._8_4_ = auVar180._8_4_ * fVar217;
      auVar51._12_4_ = auVar180._12_4_ * fVar168;
      auVar51._16_4_ = auVar180._16_4_ * fVar218;
      auVar51._20_4_ = auVar180._20_4_ * fVar169;
      auVar51._24_4_ = auVar180._24_4_ * fVar219;
      auVar51._28_4_ = auVar180._28_4_;
      auVar52._4_4_ = local_d8._4_4_ * fVar220;
      auVar52._0_4_ = local_d8._0_4_ * fVar170;
      auVar52._8_4_ = local_d8._8_4_ * fVar235;
      auVar52._12_4_ = local_d8._12_4_ * fVar237;
      auVar52._16_4_ = local_d8._16_4_ * fVar239;
      auVar52._20_4_ = local_d8._20_4_ * fVar289;
      auVar52._24_4_ = local_d8._24_4_ * fVar291;
      auVar52._28_4_ = local_d8._28_4_;
      auVar24 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar167 * fStack_134;
      auVar53._0_4_ = fVar216 * local_138;
      auVar53._8_4_ = fVar217 * fStack_130;
      auVar53._12_4_ = fVar168 * fStack_12c;
      auVar53._16_4_ = fVar218 * fStack_128;
      auVar53._20_4_ = fVar169 * fStack_124;
      auVar53._24_4_ = fVar219 * fStack_120;
      auVar53._28_4_ = auVar180._28_4_;
      auVar54._4_4_ = fVar220 * fStack_114;
      auVar54._0_4_ = fVar170 * local_118;
      auVar54._8_4_ = fVar235 * fStack_110;
      auVar54._12_4_ = fVar237 * fStack_10c;
      auVar54._16_4_ = fVar239 * fStack_108;
      auVar54._20_4_ = fVar289 * fStack_104;
      auVar54._24_4_ = fVar291 * fStack_100;
      auVar54._28_4_ = fVar166;
      auVar25 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = fVar167 * (float)local_598._4_4_;
      auVar55._0_4_ = fVar216 * (float)local_598._0_4_;
      auVar55._8_4_ = fVar217 * fStack_590;
      auVar55._12_4_ = fVar168 * fStack_58c;
      auVar55._16_4_ = fVar218 * fStack_588;
      auVar55._20_4_ = fVar169 * fStack_584;
      auVar55._24_4_ = fVar219 * fStack_580;
      auVar55._28_4_ = fVar166;
      auVar56._4_4_ = fVar220 * (float)local_5f8._4_4_;
      auVar56._0_4_ = fVar170 * (float)local_5f8._0_4_;
      auVar56._8_4_ = fVar235 * fStack_5f0;
      auVar56._12_4_ = fVar237 * fStack_5ec;
      auVar56._16_4_ = fVar239 * fStack_5e8;
      auVar56._20_4_ = fVar289 * fStack_5e4;
      auVar56._24_4_ = fVar291 * fStack_5e0;
      auVar56._28_4_ = auVar20._28_4_;
      auVar29 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = local_f8._4_4_ * fVar167;
      auVar57._0_4_ = local_f8._0_4_ * fVar216;
      auVar57._8_4_ = local_f8._8_4_ * fVar217;
      auVar57._12_4_ = local_f8._12_4_ * fVar168;
      auVar57._16_4_ = local_f8._16_4_ * fVar218;
      auVar57._20_4_ = local_f8._20_4_ * fVar169;
      auVar57._24_4_ = local_f8._24_4_ * fVar219;
      auVar57._28_4_ = auVar20._28_4_;
      auVar58._4_4_ = local_418._4_4_ * fVar220;
      auVar58._0_4_ = local_418._0_4_ * fVar170;
      auVar58._8_4_ = local_418._8_4_ * fVar235;
      auVar58._12_4_ = local_418._12_4_ * fVar237;
      auVar58._16_4_ = local_418._16_4_ * fVar239;
      auVar58._20_4_ = local_418._20_4_ * fVar289;
      uVar76 = local_418._28_4_;
      auVar58._24_4_ = local_418._24_4_ * fVar291;
      auVar58._28_4_ = uVar76;
      auVar30 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = auVar273._4_4_ * fVar167;
      auVar59._0_4_ = auVar273._0_4_ * fVar216;
      auVar59._8_4_ = auVar273._8_4_ * fVar217;
      auVar59._12_4_ = auVar273._12_4_ * fVar168;
      auVar59._16_4_ = auVar273._16_4_ * fVar218;
      auVar59._20_4_ = auVar273._20_4_ * fVar169;
      auVar59._24_4_ = auVar273._24_4_ * fVar219;
      auVar59._28_4_ = uVar76;
      auVar60._4_4_ = auVar251._4_4_ * fVar220;
      auVar60._0_4_ = auVar251._0_4_ * fVar170;
      auVar60._8_4_ = auVar251._8_4_ * fVar235;
      auVar60._12_4_ = auVar251._12_4_ * fVar237;
      auVar60._16_4_ = auVar251._16_4_ * fVar239;
      auVar60._20_4_ = auVar251._20_4_ * fVar289;
      auVar60._24_4_ = auVar251._24_4_ * fVar291;
      auVar60._28_4_ = auVar251._28_4_;
      auVar96 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar167 * fStack_174;
      auVar61._0_4_ = fVar216 * local_178;
      auVar61._8_4_ = fVar217 * fStack_170;
      auVar61._12_4_ = fVar168 * fStack_16c;
      auVar61._16_4_ = fVar218 * fStack_168;
      auVar61._20_4_ = fVar169 * fStack_164;
      auVar61._24_4_ = fVar219 * fStack_160;
      auVar61._28_4_ = uVar76;
      auVar62._4_4_ = fVar220 * fStack_154;
      auVar62._0_4_ = fVar170 * local_158;
      auVar62._8_4_ = fVar235 * fStack_150;
      auVar62._12_4_ = fVar237 * fStack_14c;
      auVar62._16_4_ = fVar239 * fStack_148;
      auVar62._20_4_ = fVar289 * fStack_144;
      auVar62._24_4_ = fVar291 * fStack_140;
      auVar62._28_4_ = auVar273._28_4_;
      auVar97 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = fVar167 * local_b8._4_4_;
      auVar63._0_4_ = fVar216 * local_b8._0_4_;
      auVar63._8_4_ = fVar217 * local_b8._8_4_;
      auVar63._12_4_ = fVar168 * local_b8._12_4_;
      auVar63._16_4_ = fVar218 * local_b8._16_4_;
      auVar63._20_4_ = fVar169 * local_b8._20_4_;
      auVar63._24_4_ = fVar219 * local_b8._24_4_;
      auVar63._28_4_ = auVar273._28_4_;
      auVar64._4_4_ = fStack_4e4 * fVar220;
      auVar64._0_4_ = local_4e8 * fVar170;
      auVar64._8_4_ = fStack_4e0 * fVar235;
      auVar64._12_4_ = fStack_4dc * fVar237;
      auVar64._16_4_ = fStack_4d8 * fVar239;
      auVar64._20_4_ = fStack_4d4 * fVar289;
      auVar64._24_4_ = fStack_4d0 * fVar291;
      auVar64._28_4_ = local_f8._28_4_;
      auVar98 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = fVar167 * auVar23._4_4_;
      auVar65._0_4_ = fVar216 * auVar23._0_4_;
      auVar65._8_4_ = fVar217 * auVar23._8_4_;
      auVar65._12_4_ = fVar168 * auVar23._12_4_;
      auVar65._16_4_ = fVar218 * auVar23._16_4_;
      auVar65._20_4_ = fVar169 * auVar23._20_4_;
      auVar65._24_4_ = fVar219 * auVar23._24_4_;
      auVar65._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar66._4_4_ = auVar22._4_4_ * fVar220;
      auVar66._0_4_ = auVar22._0_4_ * fVar170;
      auVar66._8_4_ = auVar22._8_4_ * fVar235;
      auVar66._12_4_ = auVar22._12_4_ * fVar237;
      auVar66._16_4_ = auVar22._16_4_ * fVar239;
      auVar66._20_4_ = auVar22._20_4_ * fVar289;
      auVar66._24_4_ = auVar22._24_4_ * fVar291;
      auVar66._28_4_ = auVar21._28_4_ + fVar166;
      auVar23 = vsubps_avx(auVar65,auVar66);
      auVar19 = vminps_avx(auVar24,auVar25);
      auVar18 = vmaxps_avx(auVar24,auVar25);
      auVar20 = vminps_avx(auVar29,auVar30);
      auVar20 = vminps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar29,auVar30);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar21 = vminps_avx(auVar96,auVar97);
      auVar19 = vmaxps_avx(auVar96,auVar97);
      auVar22 = vminps_avx(auVar98,auVar23);
      auVar21 = vminps_avx(auVar21,auVar22);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar98,auVar23);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar21,local_78,2);
      auVar19 = vcmpps_avx(auVar19,local_98,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar95 = vandps_avx(local_198,auVar95);
      auVar19 = auVar95 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar18,auVar95);
        uVar69 = vmovmskps_avx(auVar95);
        if (uVar69 != 0) {
          mask_stack[uVar74] = uVar69 & 0xff;
          BVar4 = (BBox1f)vmovlps_avx(auVar204);
          cu_stack[uVar74] = BVar4;
          BVar4 = (BBox1f)vmovlps_avx(auVar203);
          cv_stack[uVar74] = BVar4;
          uVar74 = (ulong)((int)uVar74 + 1);
        }
      }
    }
LAB_009f6d77:
    do {
      do {
        do {
          do {
            if ((int)uVar74 == 0) {
              if (bVar75) goto LAB_009f7d98;
              uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar105._4_4_ = uVar76;
              auVar105._0_4_ = uVar76;
              auVar105._8_4_ = uVar76;
              auVar105._12_4_ = uVar76;
              auVar105._16_4_ = uVar76;
              auVar105._20_4_ = uVar76;
              auVar105._24_4_ = uVar76;
              auVar105._28_4_ = uVar76;
              auVar95 = vcmpps_avx(local_1b8,auVar105,2);
              uVar70 = vmovmskps_avx(auVar95);
              uVar71 = (ulong)((uint)uVar71 & (uint)uVar71 + 0xff & uVar70);
              goto LAB_009f5f42;
            }
            uVar73 = (int)uVar74 - 1;
            uVar69 = mask_stack[uVar73];
            fVar166 = cu_stack[uVar73].lower;
            fVar216 = cu_stack[uVar73].upper;
            auVar326._8_8_ = 0;
            auVar326._0_4_ = cv_stack[uVar73].lower;
            auVar326._4_4_ = cv_stack[uVar73].upper;
            auVar332 = ZEXT1664(auVar326);
            uVar17 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar69 = uVar69 - 1 & uVar69;
            mask_stack[uVar73] = uVar69;
            if (uVar69 == 0) {
              uVar74 = (ulong)uVar73;
            }
            fVar217 = (float)(uVar17 + 1) * 0.14285715;
            fVar167 = (1.0 - (float)uVar17 * 0.14285715) * fVar166 +
                      fVar216 * (float)uVar17 * 0.14285715;
            fVar166 = (1.0 - fVar217) * fVar166 + fVar216 * fVar217;
            fVar216 = fVar166 - fVar167;
            if (0.16666667 <= fVar216) {
              auVar84 = vinsertps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar166),0x10);
              auVar339 = ZEXT1664(auVar84);
              goto LAB_009f671d;
            }
            auVar84 = vshufps_avx(auVar326,auVar326,0x50);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar108 = vsubps_avx(auVar111,auVar84);
            fVar217 = auVar84._0_4_;
            fVar168 = auVar84._4_4_;
            fVar218 = auVar84._8_4_;
            fVar169 = auVar84._12_4_;
            fVar219 = auVar108._0_4_;
            fVar170 = auVar108._4_4_;
            fVar220 = auVar108._8_4_;
            fVar235 = auVar108._12_4_;
            auVar142._0_4_ = auVar305._0_4_ * fVar217 + fVar219 * fVar171;
            auVar142._4_4_ = auVar305._4_4_ * fVar168 + fVar170 * fVar222;
            auVar142._8_4_ = auVar305._0_4_ * fVar218 + fVar220 * fVar171;
            auVar142._12_4_ = auVar305._4_4_ * fVar169 + fVar235 * fVar222;
            auVar185._0_4_ = auVar257._0_4_ * fVar217 + fVar219 * fVar221;
            auVar185._4_4_ = auVar257._4_4_ * fVar168 + fVar170 * fVar234;
            auVar185._8_4_ = auVar257._0_4_ * fVar218 + fVar220 * fVar221;
            auVar185._12_4_ = auVar257._4_4_ * fVar169 + fVar235 * fVar234;
            auVar207._0_4_ = auVar110._0_4_ * fVar217 + auVar324._0_4_ * fVar219;
            auVar207._4_4_ = auVar110._4_4_ * fVar168 + auVar324._4_4_ * fVar170;
            auVar207._8_4_ = auVar110._0_4_ * fVar218 + auVar324._0_4_ * fVar220;
            auVar207._12_4_ = auVar110._4_4_ * fVar169 + auVar324._4_4_ * fVar235;
            auVar81._0_4_ = auVar80._0_4_ * fVar217 + auVar316._0_4_ * fVar219;
            auVar81._4_4_ = auVar80._4_4_ * fVar168 + auVar316._4_4_ * fVar170;
            auVar81._8_4_ = auVar80._0_4_ * fVar218 + auVar316._0_4_ * fVar220;
            auVar81._12_4_ = auVar80._4_4_ * fVar169 + auVar316._4_4_ * fVar235;
            auVar136._16_16_ = auVar142;
            auVar136._0_16_ = auVar142;
            auVar164._16_16_ = auVar185;
            auVar164._0_16_ = auVar185;
            auVar199._16_16_ = auVar207;
            auVar199._0_16_ = auVar207;
            auVar95 = ZEXT2032(CONCAT416(fVar166,ZEXT416((uint)fVar167)));
            auVar95 = vshufps_avx(auVar95,auVar95,0);
            auVar18 = vsubps_avx(auVar164,auVar136);
            fVar217 = auVar95._0_4_;
            fVar168 = auVar95._4_4_;
            fVar218 = auVar95._8_4_;
            fVar169 = auVar95._12_4_;
            fVar219 = auVar95._16_4_;
            fVar170 = auVar95._20_4_;
            fVar220 = auVar95._24_4_;
            auVar137._0_4_ = auVar142._0_4_ + auVar18._0_4_ * fVar217;
            auVar137._4_4_ = auVar142._4_4_ + auVar18._4_4_ * fVar168;
            auVar137._8_4_ = auVar142._8_4_ + auVar18._8_4_ * fVar218;
            auVar137._12_4_ = auVar142._12_4_ + auVar18._12_4_ * fVar169;
            auVar137._16_4_ = auVar142._0_4_ + auVar18._16_4_ * fVar219;
            auVar137._20_4_ = auVar142._4_4_ + auVar18._20_4_ * fVar170;
            auVar137._24_4_ = auVar142._8_4_ + auVar18._24_4_ * fVar220;
            auVar137._28_4_ = auVar142._12_4_ + auVar18._28_4_;
            auVar95 = vsubps_avx(auVar199,auVar164);
            auVar165._0_4_ = auVar185._0_4_ + auVar95._0_4_ * fVar217;
            auVar165._4_4_ = auVar185._4_4_ + auVar95._4_4_ * fVar168;
            auVar165._8_4_ = auVar185._8_4_ + auVar95._8_4_ * fVar218;
            auVar165._12_4_ = auVar185._12_4_ + auVar95._12_4_ * fVar169;
            auVar165._16_4_ = auVar185._0_4_ + auVar95._16_4_ * fVar219;
            auVar165._20_4_ = auVar185._4_4_ + auVar95._20_4_ * fVar170;
            auVar165._24_4_ = auVar185._8_4_ + auVar95._24_4_ * fVar220;
            auVar165._28_4_ = auVar185._12_4_ + auVar95._28_4_;
            auVar84 = vsubps_avx(auVar81,auVar207);
            auVar103._0_4_ = auVar207._0_4_ + auVar84._0_4_ * fVar217;
            auVar103._4_4_ = auVar207._4_4_ + auVar84._4_4_ * fVar168;
            auVar103._8_4_ = auVar207._8_4_ + auVar84._8_4_ * fVar218;
            auVar103._12_4_ = auVar207._12_4_ + auVar84._12_4_ * fVar169;
            auVar103._16_4_ = auVar207._0_4_ + auVar84._0_4_ * fVar219;
            auVar103._20_4_ = auVar207._4_4_ + auVar84._4_4_ * fVar170;
            auVar103._24_4_ = auVar207._8_4_ + auVar84._8_4_ * fVar220;
            auVar103._28_4_ = auVar207._12_4_ + auVar84._12_4_;
            auVar95 = vsubps_avx(auVar165,auVar137);
            auVar138._0_4_ = auVar137._0_4_ + fVar217 * auVar95._0_4_;
            auVar138._4_4_ = auVar137._4_4_ + fVar168 * auVar95._4_4_;
            auVar138._8_4_ = auVar137._8_4_ + fVar218 * auVar95._8_4_;
            auVar138._12_4_ = auVar137._12_4_ + fVar169 * auVar95._12_4_;
            auVar138._16_4_ = auVar137._16_4_ + fVar219 * auVar95._16_4_;
            auVar138._20_4_ = auVar137._20_4_ + fVar170 * auVar95._20_4_;
            auVar138._24_4_ = auVar137._24_4_ + fVar220 * auVar95._24_4_;
            auVar138._28_4_ = auVar137._28_4_ + auVar95._28_4_;
            auVar95 = vsubps_avx(auVar103,auVar165);
            auVar104._0_4_ = auVar165._0_4_ + fVar217 * auVar95._0_4_;
            auVar104._4_4_ = auVar165._4_4_ + fVar168 * auVar95._4_4_;
            auVar104._8_4_ = auVar165._8_4_ + fVar218 * auVar95._8_4_;
            auVar104._12_4_ = auVar165._12_4_ + fVar169 * auVar95._12_4_;
            auVar104._16_4_ = auVar165._16_4_ + fVar219 * auVar95._16_4_;
            auVar104._20_4_ = auVar165._20_4_ + fVar170 * auVar95._20_4_;
            auVar104._24_4_ = auVar165._24_4_ + fVar220 * auVar95._24_4_;
            auVar104._28_4_ = auVar165._28_4_ + auVar95._28_4_;
            auVar95 = vsubps_avx(auVar104,auVar138);
            auVar230._0_4_ = auVar138._0_4_ + fVar217 * auVar95._0_4_;
            auVar230._4_4_ = auVar138._4_4_ + fVar168 * auVar95._4_4_;
            auVar230._8_4_ = auVar138._8_4_ + fVar218 * auVar95._8_4_;
            auVar230._12_4_ = auVar138._12_4_ + fVar169 * auVar95._12_4_;
            auVar233._16_4_ = auVar138._16_4_ + fVar219 * auVar95._16_4_;
            auVar233._0_16_ = auVar230;
            auVar233._20_4_ = auVar138._20_4_ + fVar170 * auVar95._20_4_;
            auVar233._24_4_ = auVar138._24_4_ + fVar220 * auVar95._24_4_;
            auVar233._28_4_ = auVar138._28_4_ + auVar165._28_4_;
            auVar182 = auVar233._16_16_;
            auVar113 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.33333334)),
                                   ZEXT416((uint)(fVar216 * 0.33333334)),0);
            auVar186._0_4_ = auVar230._0_4_ + auVar113._0_4_ * auVar95._0_4_ * 3.0;
            auVar186._4_4_ = auVar230._4_4_ + auVar113._4_4_ * auVar95._4_4_ * 3.0;
            auVar186._8_4_ = auVar230._8_4_ + auVar113._8_4_ * auVar95._8_4_ * 3.0;
            auVar186._12_4_ = auVar230._12_4_ + auVar113._12_4_ * auVar95._12_4_ * 3.0;
            auVar109 = vshufpd_avx(auVar230,auVar230,3);
            auVar125 = vshufpd_avx(auVar182,auVar182,3);
            _local_418 = auVar109;
            auVar84 = vsubps_avx(auVar109,auVar230);
            auVar108 = vsubps_avx(auVar125,auVar182);
            auVar82._0_4_ = auVar84._0_4_ + auVar108._0_4_;
            auVar82._4_4_ = auVar84._4_4_ + auVar108._4_4_;
            auVar82._8_4_ = auVar84._8_4_ + auVar108._8_4_;
            auVar82._12_4_ = auVar84._12_4_ + auVar108._12_4_;
            auVar84 = vmovshdup_avx(auVar230);
            auVar108 = vmovshdup_avx(auVar186);
            auVar144 = vshufps_avx(auVar82,auVar82,0);
            auVar114 = vshufps_avx(auVar82,auVar82,0x55);
            fVar217 = auVar114._0_4_;
            fVar168 = auVar114._4_4_;
            fVar218 = auVar114._8_4_;
            fVar169 = auVar114._12_4_;
            fVar219 = auVar144._0_4_;
            fVar170 = auVar144._4_4_;
            fVar220 = auVar144._8_4_;
            fVar235 = auVar144._12_4_;
            auVar83._0_4_ = fVar219 * auVar230._0_4_ + auVar84._0_4_ * fVar217;
            auVar83._4_4_ = fVar170 * auVar230._4_4_ + auVar84._4_4_ * fVar168;
            auVar83._8_4_ = fVar220 * auVar230._8_4_ + auVar84._8_4_ * fVar218;
            auVar83._12_4_ = fVar235 * auVar230._12_4_ + auVar84._12_4_ * fVar169;
            auVar295._0_4_ = fVar219 * auVar186._0_4_ + auVar108._0_4_ * fVar217;
            auVar295._4_4_ = fVar170 * auVar186._4_4_ + auVar108._4_4_ * fVar168;
            auVar295._8_4_ = fVar220 * auVar186._8_4_ + auVar108._8_4_ * fVar218;
            auVar295._12_4_ = fVar235 * auVar186._12_4_ + auVar108._12_4_ * fVar169;
            auVar108 = vshufps_avx(auVar83,auVar83,0xe8);
            auVar144 = vshufps_avx(auVar295,auVar295,0xe8);
            auVar84 = vcmpps_avx(auVar108,auVar144,1);
            uVar69 = vextractps_avx(auVar84,0);
            auVar114 = auVar295;
            if ((uVar69 & 1) == 0) {
              auVar114 = auVar83;
            }
            auVar112._0_4_ = auVar113._0_4_ * auVar95._16_4_ * 3.0;
            auVar112._4_4_ = auVar113._4_4_ * auVar95._20_4_ * 3.0;
            auVar112._8_4_ = auVar113._8_4_ * auVar95._24_4_ * 3.0;
            auVar112._12_4_ = auVar113._12_4_ * 0.0;
            auVar202 = vsubps_avx(auVar182,auVar112);
            auVar113 = vmovshdup_avx(auVar202);
            auVar182 = vmovshdup_avx(auVar182);
            fVar237 = auVar202._0_4_;
            fVar239 = auVar202._4_4_;
            auVar208._0_4_ = fVar237 * fVar219 + auVar113._0_4_ * fVar217;
            auVar208._4_4_ = fVar239 * fVar170 + auVar113._4_4_ * fVar168;
            auVar208._8_4_ = auVar202._8_4_ * fVar220 + auVar113._8_4_ * fVar218;
            auVar208._12_4_ = auVar202._12_4_ * fVar235 + auVar113._12_4_ * fVar169;
            auVar337._0_4_ = fVar219 * auVar233._16_4_ + auVar182._0_4_ * fVar217;
            auVar337._4_4_ = fVar170 * auVar233._20_4_ + auVar182._4_4_ * fVar168;
            auVar337._8_4_ = fVar220 * auVar233._24_4_ + auVar182._8_4_ * fVar218;
            auVar337._12_4_ = fVar235 * auVar233._28_4_ + auVar182._12_4_ * fVar169;
            auVar182 = vshufps_avx(auVar208,auVar208,0xe8);
            auVar183 = vshufps_avx(auVar337,auVar337,0xe8);
            auVar113 = vcmpps_avx(auVar182,auVar183,1);
            uVar69 = vextractps_avx(auVar113,0);
            auVar203 = auVar337;
            if ((uVar69 & 1) == 0) {
              auVar203 = auVar208;
            }
            auVar114 = vmaxss_avx(auVar203,auVar114);
            auVar108 = vminps_avx(auVar108,auVar144);
            auVar144 = vminps_avx(auVar182,auVar183);
            auVar144 = vminps_avx(auVar108,auVar144);
            auVar84 = vshufps_avx(auVar84,auVar84,0x55);
            auVar84 = vblendps_avx(auVar84,auVar113,2);
            auVar113 = vpslld_avx(auVar84,0x1f);
            auVar84 = vshufpd_avx(auVar295,auVar295,1);
            auVar84 = vinsertps_avx(auVar84,auVar337,0x9c);
            auVar108 = vshufpd_avx(auVar83,auVar83,1);
            auVar108 = vinsertps_avx(auVar108,auVar208,0x9c);
            auVar84 = vblendvps_avx(auVar108,auVar84,auVar113);
            auVar108 = vmovshdup_avx(auVar84);
            auVar84 = vmaxss_avx(auVar108,auVar84);
            fVar218 = auVar144._0_4_;
            auVar108 = vmovshdup_avx(auVar144);
            fVar168 = auVar84._0_4_;
            fVar169 = auVar108._0_4_;
            fVar217 = auVar114._0_4_;
            if ((fVar218 < 0.0001) && (-0.0001 < fVar168)) break;
            if ((fVar169 < 0.0001 && -0.0001 < fVar217) || (fVar218 < 0.0001 && -0.0001 < fVar217))
            break;
            auVar113 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar84,1);
            auVar108 = vcmpps_avx(auVar108,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar108 = vandps_avx(auVar108,auVar113);
          } while ((auVar108 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar113 = vcmpps_avx(auVar144,_DAT_01f45a50,1);
          auVar108 = vcmpss_avx(auVar114,ZEXT416(0) << 0x20,1);
          auVar143._8_4_ = 0x3f800000;
          auVar143._0_8_ = 0x3f8000003f800000;
          auVar143._12_4_ = 0x3f800000;
          auVar187._8_4_ = 0xbf800000;
          auVar187._0_8_ = 0xbf800000bf800000;
          auVar187._12_4_ = 0xbf800000;
          auVar108 = vblendvps_avx(auVar143,auVar187,auVar108);
          auVar113 = vblendvps_avx(auVar143,auVar187,auVar113);
          auVar144 = vcmpss_avx(auVar113,auVar108,4);
          auVar144 = vpshufd_avx(ZEXT416(auVar144._0_4_ & 1),0x50);
          auVar144 = vpslld_avx(auVar144,0x1f);
          auVar144 = vpsrad_avx(auVar144,0x1f);
          auVar144 = vpandn_avx(auVar144,_DAT_01f7afb0);
          auVar114 = vmovshdup_avx(auVar113);
          fVar219 = auVar114._0_4_;
          if ((auVar113._0_4_ != fVar219) || (NAN(auVar113._0_4_) || NAN(fVar219))) {
            if ((fVar169 != fVar218) || (NAN(fVar169) || NAN(fVar218))) {
              fVar218 = -fVar218 / (fVar169 - fVar218);
              auVar113 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar218) * 0.0 + fVar218)));
            }
            else {
              auVar113 = ZEXT816(0x3f80000000000000);
              if ((fVar218 != 0.0) || (NAN(fVar218))) {
                auVar113 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar182 = vcmpps_avx(auVar144,auVar113,1);
            auVar114 = vblendps_avx(auVar144,auVar113,2);
            auVar113 = vblendps_avx(auVar113,auVar144,2);
            auVar144 = vblendvps_avx(auVar113,auVar114,auVar182);
          }
          auVar84 = vcmpss_avx(auVar84,ZEXT416(0) << 0x20,1);
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = 0x3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          auVar188._8_4_ = 0xbf800000;
          auVar188._0_8_ = 0xbf800000bf800000;
          auVar188._12_4_ = 0xbf800000;
          auVar84 = vblendvps_avx(auVar145,auVar188,auVar84);
          fVar218 = auVar84._0_4_;
          if ((auVar108._0_4_ != fVar218) || (NAN(auVar108._0_4_) || NAN(fVar218))) {
            if ((fVar168 != fVar217) || (NAN(fVar168) || NAN(fVar217))) {
              fVar217 = -fVar217 / (fVar168 - fVar217);
              auVar84 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar217) * 0.0 + fVar217)));
            }
            else {
              auVar84 = ZEXT816(0x3f80000000000000);
              if ((fVar217 != 0.0) || (NAN(fVar217))) {
                auVar84 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar113 = vcmpps_avx(auVar144,auVar84,1);
            auVar108 = vblendps_avx(auVar144,auVar84,2);
            auVar84 = vblendps_avx(auVar84,auVar144,2);
            auVar144 = vblendvps_avx(auVar84,auVar108,auVar113);
          }
          if ((fVar219 != fVar218) || (NAN(fVar219) || NAN(fVar218))) {
            auVar85._8_4_ = 0x3f800000;
            auVar85._0_8_ = 0x3f8000003f800000;
            auVar85._12_4_ = 0x3f800000;
            auVar84 = vcmpps_avx(auVar144,auVar85,1);
            auVar108 = vinsertps_avx(auVar144,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar146._4_12_ = auVar144._4_12_;
            auVar146._0_4_ = 0x3f800000;
            auVar144 = vblendvps_avx(auVar146,auVar108,auVar84);
          }
          auVar84 = vcmpps_avx(auVar144,_DAT_01f46740,1);
          auVar68._12_4_ = 0;
          auVar68._0_12_ = auVar144._4_12_;
          auVar108 = vinsertps_avx(auVar144,ZEXT416(0x3f800000),0x10);
          auVar84 = vblendvps_avx(auVar108,auVar68 << 0x20,auVar84);
          auVar108 = vmovshdup_avx(auVar84);
        } while (auVar108._0_4_ < auVar84._0_4_);
        auVar86._0_4_ = auVar84._0_4_ + -0.1;
        auVar86._4_4_ = auVar84._4_4_ + 0.1;
        auVar86._8_4_ = auVar84._8_4_ + 0.0;
        auVar86._12_4_ = auVar84._12_4_ + 0.0;
        auVar113 = vshufpd_avx(auVar186,auVar186,3);
        auVar231._8_8_ = 0x3f80000000000000;
        auVar231._0_8_ = 0x3f80000000000000;
        auVar84 = vcmpps_avx(auVar86,auVar231,1);
        auVar67._12_4_ = 0;
        auVar67._0_12_ = auVar86._4_12_;
        auVar108 = vinsertps_avx(auVar86,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar84 = vblendvps_avx(auVar108,auVar67 << 0x20,auVar84);
        auVar108 = vshufpd_avx(auVar202,auVar202,3);
        auVar144 = vshufps_avx(auVar84,auVar84,0x50);
        auVar327._8_4_ = 0x3f800000;
        auVar327._0_8_ = 0x3f8000003f800000;
        auVar327._12_4_ = 0x3f800000;
        auVar114 = vsubps_avx(auVar327,auVar144);
        local_418._0_4_ = auVar109._0_4_;
        local_418._4_4_ = auVar109._4_4_;
        fStack_410 = auVar109._8_4_;
        fStack_40c = auVar109._12_4_;
        fVar217 = auVar144._0_4_;
        fVar168 = auVar144._4_4_;
        fVar218 = auVar144._8_4_;
        fVar169 = auVar144._12_4_;
        local_5b8 = auVar125._0_4_;
        fStack_5b4 = auVar125._4_4_;
        fStack_5b0 = auVar125._8_4_;
        fStack_5ac = auVar125._12_4_;
        fVar219 = auVar114._0_4_;
        fVar170 = auVar114._4_4_;
        fVar220 = auVar114._8_4_;
        fVar235 = auVar114._12_4_;
        auVar87._0_4_ = fVar217 * (float)local_418._0_4_ + fVar219 * auVar230._0_4_;
        auVar87._4_4_ = fVar168 * (float)local_418._4_4_ + fVar170 * auVar230._4_4_;
        auVar87._8_4_ = fVar218 * fStack_410 + fVar220 * auVar230._0_4_;
        auVar87._12_4_ = fVar169 * fStack_40c + fVar235 * auVar230._4_4_;
        auVar209._0_4_ = auVar113._0_4_ * fVar217 + fVar219 * auVar186._0_4_;
        auVar209._4_4_ = auVar113._4_4_ * fVar168 + fVar170 * auVar186._4_4_;
        auVar209._8_4_ = auVar113._8_4_ * fVar218 + fVar220 * auVar186._0_4_;
        auVar209._12_4_ = auVar113._12_4_ * fVar169 + fVar235 * auVar186._4_4_;
        auVar247._0_4_ = auVar108._0_4_ * fVar217 + fVar219 * fVar237;
        auVar247._4_4_ = auVar108._4_4_ * fVar168 + fVar170 * fVar239;
        auVar247._8_4_ = auVar108._8_4_ * fVar218 + fVar220 * fVar237;
        auVar247._12_4_ = auVar108._12_4_ * fVar169 + fVar235 * fVar239;
        auVar281._0_4_ = fVar217 * local_5b8 + fVar219 * auVar233._16_4_;
        auVar281._4_4_ = fVar168 * fStack_5b4 + fVar170 * auVar233._20_4_;
        auVar281._8_4_ = fVar218 * fStack_5b0 + fVar220 * auVar233._16_4_;
        auVar281._12_4_ = fVar169 * fStack_5ac + fVar235 * auVar233._20_4_;
        auVar125 = vsubps_avx(auVar327,auVar84);
        auVar108 = vmovshdup_avx(auVar326);
        auVar109 = vmovsldup_avx(auVar326);
        auVar338._0_4_ = auVar125._0_4_ * auVar109._0_4_ + auVar84._0_4_ * auVar108._0_4_;
        auVar338._4_4_ = auVar125._4_4_ * auVar109._4_4_ + auVar84._4_4_ * auVar108._4_4_;
        auVar338._8_4_ = auVar125._8_4_ * auVar109._8_4_ + auVar84._8_4_ * auVar108._8_4_;
        auVar338._12_4_ = auVar125._12_4_ * auVar109._12_4_ + auVar84._12_4_ * auVar108._12_4_;
        auVar202 = vmovshdup_avx(auVar338);
        auVar84 = vsubps_avx(auVar209,auVar87);
        auVar147._0_4_ = auVar84._0_4_ * 3.0;
        auVar147._4_4_ = auVar84._4_4_ * 3.0;
        auVar147._8_4_ = auVar84._8_4_ * 3.0;
        auVar147._12_4_ = auVar84._12_4_ * 3.0;
        auVar84 = vsubps_avx(auVar247,auVar209);
        auVar174._0_4_ = auVar84._0_4_ * 3.0;
        auVar174._4_4_ = auVar84._4_4_ * 3.0;
        auVar174._8_4_ = auVar84._8_4_ * 3.0;
        auVar174._12_4_ = auVar84._12_4_ * 3.0;
        auVar84 = vsubps_avx(auVar281,auVar247);
        auVar258._0_4_ = auVar84._0_4_ * 3.0;
        auVar258._4_4_ = auVar84._4_4_ * 3.0;
        auVar258._8_4_ = auVar84._8_4_ * 3.0;
        auVar258._12_4_ = auVar84._12_4_ * 3.0;
        auVar108 = vminps_avx(auVar174,auVar258);
        auVar84 = vmaxps_avx(auVar174,auVar258);
        auVar108 = vminps_avx(auVar147,auVar108);
        auVar84 = vmaxps_avx(auVar147,auVar84);
        auVar109 = vshufpd_avx(auVar108,auVar108,3);
        auVar125 = vshufpd_avx(auVar84,auVar84,3);
        auVar108 = vminps_avx(auVar108,auVar109);
        auVar84 = vmaxps_avx(auVar84,auVar125);
        auVar109 = vshufps_avx(ZEXT416((uint)(1.0 / fVar216)),ZEXT416((uint)(1.0 / fVar216)),0);
        auVar259._0_4_ = auVar109._0_4_ * auVar108._0_4_;
        auVar259._4_4_ = auVar109._4_4_ * auVar108._4_4_;
        auVar259._8_4_ = auVar109._8_4_ * auVar108._8_4_;
        auVar259._12_4_ = auVar109._12_4_ * auVar108._12_4_;
        auVar268._0_4_ = auVar109._0_4_ * auVar84._0_4_;
        auVar268._4_4_ = auVar109._4_4_ * auVar84._4_4_;
        auVar268._8_4_ = auVar109._8_4_ * auVar84._8_4_;
        auVar268._12_4_ = auVar109._12_4_ * auVar84._12_4_;
        auVar114 = ZEXT416((uint)(1.0 / (auVar202._0_4_ - auVar338._0_4_)));
        auVar84 = vshufpd_avx(auVar87,auVar87,3);
        auVar108 = vshufpd_avx(auVar209,auVar209,3);
        auVar109 = vshufpd_avx(auVar247,auVar247,3);
        auVar125 = vshufpd_avx(auVar281,auVar281,3);
        auVar84 = vsubps_avx(auVar84,auVar87);
        auVar113 = vsubps_avx(auVar108,auVar209);
        auVar144 = vsubps_avx(auVar109,auVar247);
        auVar125 = vsubps_avx(auVar125,auVar281);
        auVar108 = vminps_avx(auVar84,auVar113);
        auVar84 = vmaxps_avx(auVar84,auVar113);
        auVar109 = vminps_avx(auVar144,auVar125);
        auVar109 = vminps_avx(auVar108,auVar109);
        auVar108 = vmaxps_avx(auVar144,auVar125);
        auVar84 = vmaxps_avx(auVar84,auVar108);
        auVar108 = vshufps_avx(auVar114,auVar114,0);
        auVar317._0_4_ = auVar108._0_4_ * auVar109._0_4_;
        auVar317._4_4_ = auVar108._4_4_ * auVar109._4_4_;
        auVar317._8_4_ = auVar108._8_4_ * auVar109._8_4_;
        auVar317._12_4_ = auVar108._12_4_ * auVar109._12_4_;
        auVar328._0_4_ = auVar108._0_4_ * auVar84._0_4_;
        auVar328._4_4_ = auVar108._4_4_ * auVar84._4_4_;
        auVar328._8_4_ = auVar108._8_4_ * auVar84._8_4_;
        auVar328._12_4_ = auVar108._12_4_ * auVar84._12_4_;
        auVar84 = vmovsldup_avx(auVar338);
        auVar282._4_12_ = auVar84._4_12_;
        auVar282._0_4_ = fVar167;
        auVar296._4_12_ = auVar338._4_12_;
        auVar296._0_4_ = fVar166;
        auVar175._0_4_ = (fVar167 + fVar166) * 0.5;
        auVar175._4_4_ = (auVar84._4_4_ + auVar338._4_4_) * 0.5;
        auVar175._8_4_ = (auVar84._8_4_ + auVar338._8_4_) * 0.5;
        auVar175._12_4_ = (auVar84._12_4_ + auVar338._12_4_) * 0.5;
        auVar84 = vshufps_avx(auVar175,auVar175,0);
        local_278 = auVar294._0_4_;
        fStack_274 = auVar294._4_4_;
        fStack_270 = auVar294._8_4_;
        fStack_26c = auVar294._12_4_;
        fVar217 = auVar84._0_4_;
        fVar168 = auVar84._4_4_;
        fVar218 = auVar84._8_4_;
        fVar169 = auVar84._12_4_;
        p00.field_0.i[0] = auVar5._0_4_;
        p00.field_0.i[1] = auVar5._4_4_;
        p00.field_0.i[2] = auVar5._8_4_;
        p00.field_0.i[3] = auVar5._12_4_;
        auVar115._0_4_ = fVar217 * local_278 + p00.field_0.v[0];
        auVar115._4_4_ = fVar168 * fStack_274 + p00.field_0.v[1];
        auVar115._8_4_ = fVar218 * fStack_270 + p00.field_0.v[2];
        auVar115._12_4_ = fVar169 * fStack_26c + p00.field_0.v[3];
        local_288 = auVar172._0_4_;
        fStack_284 = auVar172._4_4_;
        fStack_280 = auVar172._8_4_;
        fStack_27c = auVar172._12_4_;
        p01.field_0.i[0] = auVar6._0_4_;
        p01.field_0.i[1] = auVar6._4_4_;
        p01.field_0.i[2] = auVar6._8_4_;
        p01.field_0.i[3] = auVar6._12_4_;
        auVar148._0_4_ = fVar217 * local_288 + p01.field_0.v[0];
        auVar148._4_4_ = fVar168 * fStack_284 + p01.field_0.v[1];
        auVar148._8_4_ = fVar218 * fStack_280 + p01.field_0.v[2];
        auVar148._12_4_ = fVar169 * fStack_27c + p01.field_0.v[3];
        local_298 = auVar181._0_4_;
        fStack_294 = auVar181._4_4_;
        fStack_290 = auVar181._8_4_;
        fStack_28c = auVar181._12_4_;
        p02.field_0.i[0] = auVar7._0_4_;
        p02.field_0.i[1] = auVar7._4_4_;
        p02.field_0.i[2] = auVar7._8_4_;
        p02.field_0.i[3] = auVar7._12_4_;
        auVar210._0_4_ = fVar217 * local_298 + p02.field_0.v[0];
        auVar210._4_4_ = fVar168 * fStack_294 + p02.field_0.v[1];
        auVar210._8_4_ = fVar218 * fStack_290 + p02.field_0.v[2];
        auVar210._12_4_ = fVar169 * fStack_28c + p02.field_0.v[3];
        auVar84 = vsubps_avx(auVar148,auVar115);
        auVar116._0_4_ = auVar115._0_4_ + fVar217 * auVar84._0_4_;
        auVar116._4_4_ = auVar115._4_4_ + fVar168 * auVar84._4_4_;
        auVar116._8_4_ = auVar115._8_4_ + fVar218 * auVar84._8_4_;
        auVar116._12_4_ = auVar115._12_4_ + fVar169 * auVar84._12_4_;
        auVar84 = vsubps_avx(auVar210,auVar148);
        auVar149._0_4_ = auVar148._0_4_ + fVar217 * auVar84._0_4_;
        auVar149._4_4_ = auVar148._4_4_ + fVar168 * auVar84._4_4_;
        auVar149._8_4_ = auVar148._8_4_ + fVar218 * auVar84._8_4_;
        auVar149._12_4_ = auVar148._12_4_ + fVar169 * auVar84._12_4_;
        auVar84 = vsubps_avx(auVar149,auVar116);
        fVar217 = auVar116._0_4_ + fVar217 * auVar84._0_4_;
        fVar168 = auVar116._4_4_ + fVar168 * auVar84._4_4_;
        auVar88._0_8_ = CONCAT44(fVar168,fVar217);
        auVar88._8_4_ = auVar116._8_4_ + fVar218 * auVar84._8_4_;
        auVar88._12_4_ = auVar116._12_4_ + fVar169 * auVar84._12_4_;
        fVar218 = auVar84._0_4_ * 3.0;
        fVar169 = auVar84._4_4_ * 3.0;
        auVar117._0_8_ = CONCAT44(fVar169,fVar218);
        auVar117._8_4_ = auVar84._8_4_ * 3.0;
        auVar117._12_4_ = auVar84._12_4_ * 3.0;
        auVar150._8_8_ = auVar88._0_8_;
        auVar150._0_8_ = auVar88._0_8_;
        auVar84 = vshufpd_avx(auVar88,auVar88,3);
        auVar108 = vshufps_avx(auVar175,auVar175,0x55);
        auVar144 = vsubps_avx(auVar84,auVar150);
        auVar306._0_4_ = auVar144._0_4_ * auVar108._0_4_ + fVar217;
        auVar306._4_4_ = auVar144._4_4_ * auVar108._4_4_ + fVar168;
        auVar306._8_4_ = auVar144._8_4_ * auVar108._8_4_ + fVar217;
        auVar306._12_4_ = auVar144._12_4_ * auVar108._12_4_ + fVar168;
        auVar151._8_8_ = auVar117._0_8_;
        auVar151._0_8_ = auVar117._0_8_;
        auVar84 = vshufpd_avx(auVar117,auVar117,1);
        auVar84 = vsubps_avx(auVar84,auVar151);
        auVar118._0_4_ = auVar84._0_4_ * auVar108._0_4_ + fVar218;
        auVar118._4_4_ = auVar84._4_4_ * auVar108._4_4_ + fVar169;
        auVar118._8_4_ = auVar84._8_4_ * auVar108._8_4_ + fVar218;
        auVar118._12_4_ = auVar84._12_4_ * auVar108._12_4_ + fVar169;
        auVar108 = vmovshdup_avx(auVar118);
        auVar211._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
        auVar211._8_4_ = auVar108._8_4_ ^ 0x80000000;
        auVar211._12_4_ = auVar108._12_4_ ^ 0x80000000;
        auVar109 = vmovshdup_avx(auVar144);
        auVar84 = vunpcklps_avx(auVar109,auVar211);
        auVar125 = vshufps_avx(auVar84,auVar211,4);
        auVar89._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
        auVar89._8_4_ = -auVar144._8_4_;
        auVar89._12_4_ = -auVar144._12_4_;
        auVar84 = vmovlhps_avx(auVar89,auVar118);
        auVar113 = vshufps_avx(auVar84,auVar118,8);
        auVar84 = ZEXT416((uint)(auVar118._0_4_ * auVar109._0_4_ - auVar144._0_4_ * auVar108._0_4_))
        ;
        auVar108 = vshufps_avx(auVar84,auVar84,0);
        auVar84 = vdivps_avx(auVar125,auVar108);
        auVar108 = vdivps_avx(auVar113,auVar108);
        auVar113 = vinsertps_avx(auVar259,auVar317,0x1c);
        auVar144 = vinsertps_avx(auVar268,auVar328,0x1c);
        auVar114 = vinsertps_avx(auVar317,auVar259,0x4c);
        auVar182 = vinsertps_avx(auVar328,auVar268,0x4c);
        auVar109 = vmovsldup_avx(auVar84);
        auVar152._0_4_ = auVar109._0_4_ * auVar113._0_4_;
        auVar152._4_4_ = auVar109._4_4_ * auVar113._4_4_;
        auVar152._8_4_ = auVar109._8_4_ * auVar113._8_4_;
        auVar152._12_4_ = auVar109._12_4_ * auVar113._12_4_;
        auVar119._0_4_ = auVar144._0_4_ * auVar109._0_4_;
        auVar119._4_4_ = auVar144._4_4_ * auVar109._4_4_;
        auVar119._8_4_ = auVar144._8_4_ * auVar109._8_4_;
        auVar119._12_4_ = auVar144._12_4_ * auVar109._12_4_;
        auVar125 = vminps_avx(auVar152,auVar119);
        auVar109 = vmaxps_avx(auVar119,auVar152);
        auVar183 = vmovsldup_avx(auVar108);
        auVar329._0_4_ = auVar114._0_4_ * auVar183._0_4_;
        auVar329._4_4_ = auVar114._4_4_ * auVar183._4_4_;
        auVar329._8_4_ = auVar114._8_4_ * auVar183._8_4_;
        auVar329._12_4_ = auVar114._12_4_ * auVar183._12_4_;
        auVar153._0_4_ = auVar182._0_4_ * auVar183._0_4_;
        auVar153._4_4_ = auVar182._4_4_ * auVar183._4_4_;
        auVar153._8_4_ = auVar182._8_4_ * auVar183._8_4_;
        auVar153._12_4_ = auVar182._12_4_ * auVar183._12_4_;
        auVar183 = vminps_avx(auVar329,auVar153);
        auVar189._0_4_ = auVar125._0_4_ + auVar183._0_4_;
        auVar189._4_4_ = auVar125._4_4_ + auVar183._4_4_;
        auVar189._8_4_ = auVar125._8_4_ + auVar183._8_4_;
        auVar189._12_4_ = auVar125._12_4_ + auVar183._12_4_;
        auVar125 = vmaxps_avx(auVar153,auVar329);
        auVar183 = vsubps_avx(auVar282,auVar175);
        auVar203 = vsubps_avx(auVar296,auVar175);
        auVar120._0_4_ = auVar109._0_4_ + auVar125._0_4_;
        auVar120._4_4_ = auVar109._4_4_ + auVar125._4_4_;
        auVar120._8_4_ = auVar109._8_4_ + auVar125._8_4_;
        auVar120._12_4_ = auVar109._12_4_ + auVar125._12_4_;
        auVar154._8_8_ = 0x3f800000;
        auVar154._0_8_ = 0x3f800000;
        auVar109 = vsubps_avx(auVar154,auVar120);
        auVar125 = vsubps_avx(auVar154,auVar189);
        fVar220 = auVar183._0_4_;
        auVar190._0_4_ = fVar220 * auVar109._0_4_;
        fVar235 = auVar183._4_4_;
        auVar190._4_4_ = fVar235 * auVar109._4_4_;
        fVar237 = auVar183._8_4_;
        auVar190._8_4_ = fVar237 * auVar109._8_4_;
        fVar239 = auVar183._12_4_;
        auVar190._12_4_ = fVar239 * auVar109._12_4_;
        fVar218 = auVar203._0_4_;
        auVar121._0_4_ = fVar218 * auVar109._0_4_;
        fVar169 = auVar203._4_4_;
        auVar121._4_4_ = fVar169 * auVar109._4_4_;
        fVar219 = auVar203._8_4_;
        auVar121._8_4_ = fVar219 * auVar109._8_4_;
        fVar170 = auVar203._12_4_;
        auVar121._12_4_ = fVar170 * auVar109._12_4_;
        auVar283._0_4_ = fVar220 * auVar125._0_4_;
        auVar283._4_4_ = fVar235 * auVar125._4_4_;
        auVar283._8_4_ = fVar237 * auVar125._8_4_;
        auVar283._12_4_ = fVar239 * auVar125._12_4_;
        auVar155._0_4_ = fVar218 * auVar125._0_4_;
        auVar155._4_4_ = fVar169 * auVar125._4_4_;
        auVar155._8_4_ = fVar219 * auVar125._8_4_;
        auVar155._12_4_ = fVar170 * auVar125._12_4_;
        auVar109 = vminps_avx(auVar190,auVar283);
        auVar125 = vminps_avx(auVar121,auVar155);
        auVar183 = vminps_avx(auVar109,auVar125);
        auVar109 = vmaxps_avx(auVar283,auVar190);
        auVar125 = vmaxps_avx(auVar155,auVar121);
        auVar203 = vshufps_avx(auVar175,auVar175,0x54);
        auVar125 = vmaxps_avx(auVar125,auVar109);
        auVar204 = vshufps_avx(auVar306,auVar306,0);
        auVar205 = vshufps_avx(auVar306,auVar306,0x55);
        auVar109 = vhaddps_avx(auVar183,auVar183);
        auVar125 = vhaddps_avx(auVar125,auVar125);
        auVar176._0_4_ = auVar204._0_4_ * auVar84._0_4_ + auVar205._0_4_ * auVar108._0_4_;
        auVar176._4_4_ = auVar204._4_4_ * auVar84._4_4_ + auVar205._4_4_ * auVar108._4_4_;
        auVar176._8_4_ = auVar204._8_4_ * auVar84._8_4_ + auVar205._8_4_ * auVar108._8_4_;
        auVar176._12_4_ = auVar204._12_4_ * auVar84._12_4_ + auVar205._12_4_ * auVar108._12_4_;
        auVar183 = vsubps_avx(auVar203,auVar176);
        fVar217 = auVar183._0_4_ + auVar109._0_4_;
        fVar168 = auVar183._0_4_ + auVar125._0_4_;
        auVar109 = vmaxss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar217));
        auVar125 = vminss_avx(ZEXT416((uint)fVar168),ZEXT416((uint)fVar166));
      } while (auVar125._0_4_ < auVar109._0_4_);
      auVar109 = vmovshdup_avx(auVar84);
      auVar90._0_4_ = auVar109._0_4_ * auVar113._0_4_;
      auVar90._4_4_ = auVar109._4_4_ * auVar113._4_4_;
      auVar90._8_4_ = auVar109._8_4_ * auVar113._8_4_;
      auVar90._12_4_ = auVar109._12_4_ * auVar113._12_4_;
      auVar122._0_4_ = auVar144._0_4_ * auVar109._0_4_;
      auVar122._4_4_ = auVar144._4_4_ * auVar109._4_4_;
      auVar122._8_4_ = auVar144._8_4_ * auVar109._8_4_;
      auVar122._12_4_ = auVar144._12_4_ * auVar109._12_4_;
      auVar125 = vminps_avx(auVar90,auVar122);
      auVar109 = vmaxps_avx(auVar122,auVar90);
      auVar113 = vmovshdup_avx(auVar108);
      auVar191._0_4_ = auVar114._0_4_ * auVar113._0_4_;
      auVar191._4_4_ = auVar114._4_4_ * auVar113._4_4_;
      auVar191._8_4_ = auVar114._8_4_ * auVar113._8_4_;
      auVar191._12_4_ = auVar114._12_4_ * auVar113._12_4_;
      auVar123._0_4_ = auVar182._0_4_ * auVar113._0_4_;
      auVar123._4_4_ = auVar182._4_4_ * auVar113._4_4_;
      auVar123._8_4_ = auVar182._8_4_ * auVar113._8_4_;
      auVar123._12_4_ = auVar182._12_4_ * auVar113._12_4_;
      auVar113 = vminps_avx(auVar191,auVar123);
      auVar156._0_4_ = auVar125._0_4_ + auVar113._0_4_;
      auVar156._4_4_ = auVar125._4_4_ + auVar113._4_4_;
      auVar156._8_4_ = auVar125._8_4_ + auVar113._8_4_;
      auVar156._12_4_ = auVar125._12_4_ + auVar113._12_4_;
      auVar125 = vmaxps_avx(auVar123,auVar191);
      auVar91._0_4_ = auVar109._0_4_ + auVar125._0_4_;
      auVar91._4_4_ = auVar109._4_4_ + auVar125._4_4_;
      auVar91._8_4_ = auVar109._8_4_ + auVar125._8_4_;
      auVar91._12_4_ = auVar109._12_4_ + auVar125._12_4_;
      auVar109 = vsubps_avx(auVar231,auVar91);
      auVar125 = vsubps_avx(auVar231,auVar156);
      auVar157._0_4_ = fVar220 * auVar109._0_4_;
      auVar157._4_4_ = fVar235 * auVar109._4_4_;
      auVar157._8_4_ = fVar237 * auVar109._8_4_;
      auVar157._12_4_ = fVar239 * auVar109._12_4_;
      auVar192._0_4_ = fVar220 * auVar125._0_4_;
      auVar192._4_4_ = fVar235 * auVar125._4_4_;
      auVar192._8_4_ = fVar237 * auVar125._8_4_;
      auVar192._12_4_ = fVar239 * auVar125._12_4_;
      auVar92._0_4_ = fVar218 * auVar109._0_4_;
      auVar92._4_4_ = fVar169 * auVar109._4_4_;
      auVar92._8_4_ = fVar219 * auVar109._8_4_;
      auVar92._12_4_ = fVar170 * auVar109._12_4_;
      auVar124._0_4_ = fVar218 * auVar125._0_4_;
      auVar124._4_4_ = fVar169 * auVar125._4_4_;
      auVar124._8_4_ = fVar219 * auVar125._8_4_;
      auVar124._12_4_ = fVar170 * auVar125._12_4_;
      auVar109 = vminps_avx(auVar157,auVar192);
      auVar125 = vminps_avx(auVar92,auVar124);
      auVar109 = vminps_avx(auVar109,auVar125);
      auVar125 = vmaxps_avx(auVar192,auVar157);
      auVar113 = vmaxps_avx(auVar124,auVar92);
      auVar109 = vhaddps_avx(auVar109,auVar109);
      auVar125 = vmaxps_avx(auVar113,auVar125);
      auVar125 = vhaddps_avx(auVar125,auVar125);
      auVar113 = vmovshdup_avx(auVar183);
      auVar144 = ZEXT416((uint)(auVar113._0_4_ + auVar109._0_4_));
      auVar109 = vmaxss_avx(auVar338,auVar144);
      auVar113 = ZEXT416((uint)(auVar113._0_4_ + auVar125._0_4_));
      auVar125 = vminss_avx(auVar113,auVar202);
    } while (auVar125._0_4_ < auVar109._0_4_);
    uVar69 = 0;
    if ((fVar167 < fVar217) && (fVar168 < fVar166)) {
      auVar109 = vcmpps_avx(auVar113,auVar202,1);
      auVar125 = vcmpps_avx(auVar338,auVar144,1);
      auVar109 = vandps_avx(auVar125,auVar109);
      uVar69 = auVar109._0_4_;
    }
    auVar260._8_4_ = 0x7fffffff;
    auVar260._0_8_ = 0x7fffffff7fffffff;
    auVar260._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar8._0_4_;
    p03.field_0.i[1] = auVar8._4_4_;
    p03.field_0.i[2] = auVar8._8_4_;
    p03.field_0.i[3] = auVar8._12_4_;
    if ((3 < (uint)uVar74 || fVar216 < 0.001) || (uVar69 & 1) != 0) {
      lVar72 = 0xc9;
      do {
        lVar72 = lVar72 + -1;
        if (lVar72 == 0) goto LAB_009f6d77;
        fVar216 = auVar183._0_4_;
        fVar166 = 1.0 - fVar216;
        auVar109 = ZEXT416((uint)(fVar166 * fVar166 * fVar166));
        auVar109 = vshufps_avx(auVar109,auVar109,0);
        auVar125 = ZEXT416((uint)(fVar216 * 3.0 * fVar166 * fVar166));
        auVar125 = vshufps_avx(auVar125,auVar125,0);
        auVar113 = ZEXT416((uint)(fVar166 * fVar216 * fVar216 * 3.0));
        auVar113 = vshufps_avx(auVar113,auVar113,0);
        auVar144 = ZEXT416((uint)(fVar216 * fVar216 * fVar216));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        fVar166 = p00.field_0.v[0] * auVar109._0_4_ +
                  p01.field_0.v[0] * auVar125._0_4_ +
                  p03.field_0.v[0] * auVar144._0_4_ + p02.field_0.v[0] * auVar113._0_4_;
        fVar216 = p00.field_0.v[1] * auVar109._4_4_ +
                  p01.field_0.v[1] * auVar125._4_4_ +
                  p03.field_0.v[1] * auVar144._4_4_ + p02.field_0.v[1] * auVar113._4_4_;
        auVar93._0_8_ = CONCAT44(fVar216,fVar166);
        auVar93._8_4_ =
             p00.field_0.v[2] * auVar109._8_4_ +
             p01.field_0.v[2] * auVar125._8_4_ +
             p03.field_0.v[2] * auVar144._8_4_ + p02.field_0.v[2] * auVar113._8_4_;
        auVar93._12_4_ =
             p00.field_0.v[3] * auVar109._12_4_ +
             p01.field_0.v[3] * auVar125._12_4_ +
             p03.field_0.v[3] * auVar144._12_4_ + p02.field_0.v[3] * auVar113._12_4_;
        auVar126._8_8_ = auVar93._0_8_;
        auVar126._0_8_ = auVar93._0_8_;
        auVar125 = vshufpd_avx(auVar93,auVar93,1);
        auVar109 = vmovshdup_avx(auVar183);
        auVar125 = vsubps_avx(auVar125,auVar126);
        auVar94._0_4_ = auVar109._0_4_ * auVar125._0_4_ + fVar166;
        auVar94._4_4_ = auVar109._4_4_ * auVar125._4_4_ + fVar216;
        auVar94._8_4_ = auVar109._8_4_ * auVar125._8_4_ + fVar166;
        auVar94._12_4_ = auVar109._12_4_ * auVar125._12_4_ + fVar216;
        auVar109 = vshufps_avx(auVar94,auVar94,0);
        auVar125 = vshufps_avx(auVar94,auVar94,0x55);
        auVar127._0_4_ = auVar84._0_4_ * auVar109._0_4_ + auVar108._0_4_ * auVar125._0_4_;
        auVar127._4_4_ = auVar84._4_4_ * auVar109._4_4_ + auVar108._4_4_ * auVar125._4_4_;
        auVar127._8_4_ = auVar84._8_4_ * auVar109._8_4_ + auVar108._8_4_ * auVar125._8_4_;
        auVar127._12_4_ = auVar84._12_4_ * auVar109._12_4_ + auVar108._12_4_ * auVar125._12_4_;
        auVar183 = vsubps_avx(auVar183,auVar127);
        auVar109 = vandps_avx(auVar260,auVar94);
        auVar125 = vshufps_avx(auVar109,auVar109,0xf5);
        auVar109 = vmaxss_avx(auVar125,auVar109);
      } while (fVar200 <= auVar109._0_4_);
      fVar166 = auVar183._0_4_;
      if ((0.0 <= fVar166) && (fVar166 <= 1.0)) {
        auVar84 = vmovshdup_avx(auVar183);
        fVar216 = auVar84._0_4_;
        if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
          auVar84 = vinsertps_avx(ZEXT416((uint)(pLVar77->vx).field_0.m128[2]),
                                  ZEXT416((uint)(pLVar77->vy).field_0.m128[2]),0x1c);
          auVar182 = vinsertps_avx(auVar84,ZEXT416((uint)(pLVar77->vz).field_0.m128[2]),0x28);
          auVar84 = vdpps_avx(auVar182,auVar227,0x7f);
          auVar108 = vdpps_avx(auVar182,auVar293,0x7f);
          auVar109 = vdpps_avx(auVar182,auVar11,0x7f);
          auVar125 = vdpps_avx(auVar182,auVar79,0x7f);
          auVar113 = vdpps_avx(auVar182,auVar107,0x7f);
          auVar144 = vdpps_avx(auVar182,auVar140,0x7f);
          fVar169 = 1.0 - fVar216;
          auVar114 = vdpps_avx(auVar182,auVar9,0x7f);
          auVar182 = vdpps_avx(auVar182,auVar10,0x7f);
          fVar219 = 1.0 - fVar166;
          fVar167 = auVar183._4_4_;
          fVar217 = auVar183._8_4_;
          fVar168 = auVar183._12_4_;
          fVar218 = fVar219 * fVar166 * fVar166 * 3.0;
          auVar212._0_4_ = fVar166 * fVar166 * fVar166;
          auVar212._4_4_ = fVar167 * fVar167 * fVar167;
          auVar212._8_4_ = fVar217 * fVar217 * fVar217;
          auVar212._12_4_ = fVar168 * fVar168 * fVar168;
          fVar167 = fVar166 * 3.0 * fVar219 * fVar219;
          fVar217 = fVar219 * fVar219 * fVar219;
          fVar166 = (fVar169 * auVar84._0_4_ + fVar216 * auVar109._0_4_) * fVar217 +
                    (fVar169 * auVar108._0_4_ + fVar216 * auVar125._0_4_) * fVar167 +
                    fVar218 * (fVar169 * auVar114._0_4_ + fVar216 * auVar113._0_4_) +
                    auVar212._0_4_ * (auVar144._0_4_ * fVar216 + fVar169 * auVar182._0_4_);
          if ((fVar139 <= fVar166) && (fVar216 = *(float *)(ray + k * 4 + 0x80), fVar166 <= fVar216)
             ) {
            pGVar13 = (context->scene->geometries).items[uVar70].ptr;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar78 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar78 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_208 = vshufps_avx(auVar183,auVar183,0x55);
              auVar261._8_4_ = 0x3f800000;
              auVar261._0_8_ = 0x3f8000003f800000;
              auVar261._12_4_ = 0x3f800000;
              auVar84 = vsubps_avx(auVar261,local_208);
              fVar168 = local_208._0_4_;
              fVar169 = local_208._4_4_;
              fVar170 = local_208._8_4_;
              fVar220 = local_208._12_4_;
              local_358 = auVar106._0_4_;
              fStack_354 = auVar106._4_4_;
              fStack_350 = auVar106._8_4_;
              fStack_34c = auVar106._12_4_;
              fVar235 = auVar84._0_4_;
              fVar237 = auVar84._4_4_;
              fVar239 = auVar84._8_4_;
              fVar289 = auVar84._12_4_;
              auVar269._0_4_ = fVar168 * (float)local_438._0_4_ + fVar235 * (float)local_428._0_4_;
              auVar269._4_4_ = fVar169 * (float)local_438._4_4_ + fVar237 * (float)local_428._4_4_;
              auVar269._8_4_ = fVar170 * fStack_430 + fVar239 * fStack_420;
              auVar269._12_4_ = fVar220 * fStack_42c + fVar289 * fStack_41c;
              auVar284._0_4_ = fVar168 * (float)local_478._0_4_ + fVar235 * (float)local_458._0_4_;
              auVar284._4_4_ = fVar169 * (float)local_478._4_4_ + fVar237 * (float)local_458._4_4_;
              auVar284._8_4_ = fVar170 * fStack_470 + fVar239 * fStack_450;
              auVar284._12_4_ = fVar220 * fStack_46c + fVar289 * fStack_44c;
              auVar297._0_4_ = fVar168 * local_358 + fVar235 * (float)local_468._0_4_;
              auVar297._4_4_ = fVar169 * fStack_354 + fVar237 * (float)local_468._4_4_;
              auVar297._8_4_ = fVar170 * fStack_350 + fVar239 * fStack_460;
              auVar297._12_4_ = fVar220 * fStack_34c + fVar289 * fStack_45c;
              auVar262._0_4_ = fVar168 * fVar236 + fVar235 * (float)local_448._0_4_;
              auVar262._4_4_ = fVar169 * fVar238 + fVar237 * (float)local_448._4_4_;
              auVar262._8_4_ = fVar170 * fVar288 + fVar239 * fStack_440;
              auVar262._12_4_ = fVar220 * fVar290 + fVar289 * fStack_43c;
              auVar125 = vsubps_avx(auVar284,auVar269);
              auVar113 = vsubps_avx(auVar297,auVar284);
              auVar144 = vsubps_avx(auVar262,auVar297);
              local_218 = vshufps_avx(auVar183,auVar183,0);
              fVar168 = local_218._0_4_;
              fVar170 = local_218._4_4_;
              fVar220 = local_218._8_4_;
              fVar237 = local_218._12_4_;
              auVar84 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
              fVar169 = auVar84._0_4_;
              fVar219 = auVar84._4_4_;
              fVar235 = auVar84._8_4_;
              fVar239 = auVar84._12_4_;
              auVar84 = vshufps_avx(auVar212,auVar212,0);
              local_3b8 = auVar28._0_4_;
              fStack_3b4 = auVar28._4_4_;
              fStack_3b0 = auVar28._8_4_;
              fStack_3ac = auVar28._12_4_;
              auVar108 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
              local_3a8 = auVar27._0_4_;
              fStack_3a4 = auVar27._4_4_;
              fStack_3a0 = auVar27._8_4_;
              fStack_39c = auVar27._12_4_;
              auVar109 = vshufps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),0);
              local_398 = auVar223._0_4_;
              fStack_394 = auVar223._4_4_;
              fStack_390 = auVar223._8_4_;
              fStack_38c = auVar223._12_4_;
              auVar193._0_4_ =
                   ((auVar113._0_4_ * fVar169 + auVar144._0_4_ * fVar168) * fVar168 +
                   (auVar125._0_4_ * fVar169 + auVar113._0_4_ * fVar168) * fVar169) * 3.0;
              auVar193._4_4_ =
                   ((auVar113._4_4_ * fVar219 + auVar144._4_4_ * fVar170) * fVar170 +
                   (auVar125._4_4_ * fVar219 + auVar113._4_4_ * fVar170) * fVar219) * 3.0;
              auVar193._8_4_ =
                   ((auVar113._8_4_ * fVar235 + auVar144._8_4_ * fVar220) * fVar220 +
                   (auVar125._8_4_ * fVar235 + auVar113._8_4_ * fVar220) * fVar235) * 3.0;
              auVar193._12_4_ =
                   ((auVar113._12_4_ * fVar239 + auVar144._12_4_ * fVar237) * fVar237 +
                   (auVar125._12_4_ * fVar239 + auVar113._12_4_ * fVar237) * fVar239) * 3.0;
              auVar125 = vshufps_avx(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),0);
              local_388 = auVar201._0_4_;
              fStack_384 = auVar201._4_4_;
              fStack_380 = auVar201._8_4_;
              fStack_37c = auVar201._12_4_;
              auVar128._0_4_ =
                   auVar125._0_4_ * local_388 +
                   auVar109._0_4_ * local_398 +
                   auVar84._0_4_ * local_3b8 + auVar108._0_4_ * local_3a8;
              auVar128._4_4_ =
                   auVar125._4_4_ * fStack_384 +
                   auVar109._4_4_ * fStack_394 +
                   auVar84._4_4_ * fStack_3b4 + auVar108._4_4_ * fStack_3a4;
              auVar128._8_4_ =
                   auVar125._8_4_ * fStack_380 +
                   auVar109._8_4_ * fStack_390 +
                   auVar84._8_4_ * fStack_3b0 + auVar108._8_4_ * fStack_3a0;
              auVar128._12_4_ =
                   auVar125._12_4_ * fStack_37c +
                   auVar109._12_4_ * fStack_38c +
                   auVar84._12_4_ * fStack_3ac + auVar108._12_4_ * fStack_39c;
              auVar84 = vshufps_avx(auVar193,auVar193,0xc9);
              auVar158._0_4_ = auVar128._0_4_ * auVar84._0_4_;
              auVar158._4_4_ = auVar128._4_4_ * auVar84._4_4_;
              auVar158._8_4_ = auVar128._8_4_ * auVar84._8_4_;
              auVar158._12_4_ = auVar128._12_4_ * auVar84._12_4_;
              auVar84 = vshufps_avx(auVar128,auVar128,0xc9);
              auVar129._0_4_ = auVar193._0_4_ * auVar84._0_4_;
              auVar129._4_4_ = auVar193._4_4_ * auVar84._4_4_;
              auVar129._8_4_ = auVar193._8_4_ * auVar84._8_4_;
              auVar129._12_4_ = auVar193._12_4_ * auVar84._12_4_;
              auVar108 = vsubps_avx(auVar129,auVar158);
              auVar84 = vshufps_avx(auVar108,auVar108,0x55);
              local_248[0] = (RTCHitN)auVar84[0];
              local_248[1] = (RTCHitN)auVar84[1];
              local_248[2] = (RTCHitN)auVar84[2];
              local_248[3] = (RTCHitN)auVar84[3];
              local_248[4] = (RTCHitN)auVar84[4];
              local_248[5] = (RTCHitN)auVar84[5];
              local_248[6] = (RTCHitN)auVar84[6];
              local_248[7] = (RTCHitN)auVar84[7];
              local_248[8] = (RTCHitN)auVar84[8];
              local_248[9] = (RTCHitN)auVar84[9];
              local_248[10] = (RTCHitN)auVar84[10];
              local_248[0xb] = (RTCHitN)auVar84[0xb];
              local_248[0xc] = (RTCHitN)auVar84[0xc];
              local_248[0xd] = (RTCHitN)auVar84[0xd];
              local_248[0xe] = (RTCHitN)auVar84[0xe];
              local_248[0xf] = (RTCHitN)auVar84[0xf];
              local_238 = vshufps_avx(auVar108,auVar108,0xaa);
              local_228 = vshufps_avx(auVar108,auVar108,0);
              local_378 = auVar26._0_8_;
              uStack_370 = auVar26._8_8_;
              local_1f8 = local_378;
              uStack_1f0 = uStack_370;
              local_1e8 = auVar244;
              vcmpps_avx(ZEXT1632(auVar244),ZEXT1632(auVar244),0xf);
              uStack_1d4 = context->user->instID[0];
              local_1d8 = uStack_1d4;
              uStack_1d0 = uStack_1d4;
              uStack_1cc = uStack_1d4;
              uStack_1c8 = context->user->instPrimID[0];
              uStack_1c4 = uStack_1c8;
              uStack_1c0 = uStack_1c8;
              uStack_1bc = uStack_1c8;
              *(float *)(ray + k * 4 + 0x80) = fVar166;
              local_498 = *local_488;
              args.valid = (int *)local_498;
              args.geometryUserPtr = pGVar13->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_248;
              args.N = 4;
              if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar13->occlusionFilterN)(&args);
              }
              if (local_498 == (undefined1  [16])0x0) {
                auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar84 = auVar84 ^ _DAT_01f46b70;
              }
              else {
                p_Var16 = context->args->filter;
                if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var16)(&args);
                }
                auVar108 = vpcmpeqd_avx(local_498,_DAT_01f45a50);
                auVar84 = auVar108 ^ _DAT_01f46b70;
                auVar159._8_4_ = 0xff800000;
                auVar159._0_8_ = 0xff800000ff800000;
                auVar159._12_4_ = 0xff800000;
                auVar108 = vblendvps_avx(auVar159,*(undefined1 (*) [16])(args.ray + 0x80),auVar108);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar108;
              }
              auVar130._8_8_ = 0x100000001;
              auVar130._0_8_ = 0x100000001;
              bVar78 = (auVar130 & auVar84) != (undefined1  [16])0x0;
              if (!bVar78) {
                *(float *)(ray + k * 4 + 0x80) = fVar216;
              }
            }
            bVar75 = (bool)(bVar75 | bVar78);
            pLVar77 = local_480;
          }
        }
      }
      goto LAB_009f6d77;
    }
    auVar84 = vinsertps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar166),0x10);
    auVar339 = ZEXT1664(auVar84);
    auVar332 = ZEXT1664(auVar338);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }